

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O1

void ncnn::transpose_pack_A_tile_quantize
               (Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk,Mat *scales)

{
  float *pfVar1;
  undefined4 uVar2;
  void *pvVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 *puVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  size_t *psVar11;
  char *pcVar12;
  undefined1 (*pauVar13) [64];
  uint *puVar14;
  undefined1 (*pauVar15) [64];
  float *pfVar16;
  undefined1 (*pauVar17) [64];
  uint uVar18;
  undefined1 *puVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  uint *puVar26;
  uint *puVar27;
  undefined1 (*pauVar28) [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  __m128i _vindex;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  float fVar98;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar123 [16];
  undefined1 auVar132 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 in_ZMM15 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  long local_80;
  uint local_70;
  
  puVar19 = &stack0xffffffffffffff58;
  iVar7 = cpu_support_x86_avx512_vnni();
  if (iVar7 != 0) {
    transpose_pack_A_tile_fp32_to_int8_avx512vnni(A,AT,i,max_ii,k,max_kk,scales);
    return;
  }
  iVar7 = cpu_support_x86_avx_vnni_int8();
  if (iVar7 == 0) {
    iVar7 = cpu_support_x86_avx_vnni();
    if (iVar7 == 0) {
      iVar7 = A->elempack;
      lVar23 = (long)iVar7;
      psVar11 = (size_t *)&A->w;
      if (A->dims == 3) {
        psVar11 = &A->cstep;
      }
      iVar20 = (int)*psVar11;
      pauVar13 = (undefined1 (*) [64])AT->data;
      puVar27 = (uint *)0x0;
      puVar14 = (uint *)(long)i;
      uVar21 = (ulong)iVar20;
      if (0xf < max_ii) {
        local_70 = max_kk & 0xfffffffe;
        lVar22 = (long)(iVar20 * k) * 4 + lVar23 * (long)puVar14 * 4;
        auVar60 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar61 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
        auVar46[8] = 0x81;
        auVar46._0_8_ = 0x8181818181818181;
        auVar46[9] = 0x81;
        auVar46[10] = 0x81;
        auVar46[0xb] = 0x81;
        auVar46[0xc] = 0x81;
        auVar46[0xd] = 0x81;
        auVar46[0xe] = 0x81;
        auVar46[0xf] = 0x81;
        auVar62 = vpmovsxbw_avx512bw(_DAT_006018e0);
        auVar63 = vpmovsxbw_avx512bw(_DAT_00601900);
        auVar64 = vpmovsxbd_avx512f(_DAT_00601950);
        auVar65 = vpmovsxbd_avx512f(_DAT_00601960);
        puVar26 = (uint *)0x0;
        do {
          lVar25 = (long)puVar26 + (long)puVar14;
          auVar83 = *(undefined1 (*) [64])
                     ((long)scales->data + (long)puVar26 * 4 + (long)puVar14 * 4);
          if (max_kk < 0x10 || iVar7 != 0x10) {
            pauVar15 = (undefined1 (*) [64])
                       ((long)A->data + lVar25 * lVar23 * 4 + (long)(iVar20 * k) * 4);
          }
          else {
            iVar8 = 0xf;
            pauVar15 = (undefined1 (*) [64])((long)A->data + lVar22);
            do {
              pauVar17 = pauVar15;
              pvVar3 = scales->data;
              auVar67 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4)));
              auVar67 = vmulps_avx512f(auVar67,*pauVar17);
              auVar68 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 4)));
              auVar68 = vmulps_avx512f(auVar68,pauVar17[1]);
              auVar69 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 8)));
              auVar69 = vmulps_avx512f(auVar69,pauVar17[2]);
              auVar70 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0xc)));
              auVar70 = vmulps_avx512f(auVar70,pauVar17[3]);
              auVar71 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x10)));
              auVar71 = vmulps_avx512f(auVar71,pauVar17[4]);
              auVar72 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x14)));
              auVar72 = vmulps_avx512f(auVar72,pauVar17[5]);
              auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x18)));
              auVar73 = vmulps_avx512f(auVar73,pauVar17[6]);
              auVar74 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x1c)));
              auVar74 = vmulps_avx512f(auVar74,pauVar17[7]);
              auVar75 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x20)));
              auVar75 = vmulps_avx512f(auVar75,pauVar17[8]);
              auVar76 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x24)));
              auVar76 = vmulps_avx512f(auVar76,pauVar17[9]);
              auVar77 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x28)));
              auVar77 = vmulps_avx512f(auVar77,pauVar17[10]);
              auVar78 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x2c)));
              auVar78 = vmulps_avx512f(auVar78,pauVar17[0xb]);
              auVar79 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x30)));
              auVar79 = vmulps_avx512f(auVar79,pauVar17[0xc]);
              auVar80 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x34)));
              auVar80 = vmulps_avx512f(auVar80,pauVar17[0xd]);
              auVar81 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x38)));
              auVar81 = vmulps_avx512f(auVar81,pauVar17[0xe]);
              auVar82 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x3c)));
              auVar82 = vmulps_avx512f(auVar82,pauVar17[0xf]);
              auVar66 = vmovdqa64_avx512f(auVar61);
              auVar66 = vpternlogd_avx512f(auVar66,auVar67,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar67,auVar66);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar29 = vpmovsdb_avx512f(auVar67);
              auVar29 = vpmaxsb_avx(auVar29,auVar46);
              auVar67 = vmovdqa64_avx512f(auVar61);
              auVar67 = vpternlogd_avx512f(auVar67,auVar68,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar68,auVar67);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar30 = vpmovsdb_avx512f(auVar67);
              auVar30 = vpmaxsb_avx(auVar30,auVar46);
              auVar67 = vmovdqa64_avx512f(auVar61);
              auVar67 = vpternlogd_avx512f(auVar67,auVar69,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar69,auVar67);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar31 = vpmovsdb_avx512f(auVar67);
              auVar31 = vpmaxsb_avx(auVar31,auVar46);
              auVar67 = vmovdqa64_avx512f(auVar61);
              auVar67 = vpternlogd_avx512f(auVar67,auVar70,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar70,auVar67);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar32 = vpmovsdb_avx512f(auVar67);
              auVar32 = vpmaxsb_avx(auVar32,auVar46);
              auVar67 = vmovdqa64_avx512f(auVar61);
              auVar67 = vpternlogd_avx512f(auVar67,auVar71,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar71,auVar67);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar33 = vpmovsdb_avx512f(auVar67);
              auVar38 = vpmaxsb_avx512vl(auVar33,auVar46);
              auVar67 = vmovdqa64_avx512f(auVar61);
              auVar67 = vpternlogd_avx512f(auVar67,auVar72,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar72,auVar67);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar33 = vpmovsdb_avx512f(auVar67);
              auVar39 = vpmaxsb_avx512vl(auVar33,auVar46);
              auVar67 = vmovdqa64_avx512f(auVar61);
              auVar67 = vpternlogd_avx512f(auVar67,auVar73,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar73,auVar67);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar33 = vpmovsdb_avx512f(auVar67);
              auVar37 = vpmaxsb_avx512vl(auVar33,auVar46);
              auVar67 = vmovdqa64_avx512f(auVar61);
              auVar67 = vpternlogd_avx512f(auVar67,auVar74,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar74,auVar67);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar33 = vpmovsdb_avx512f(auVar67);
              auVar40 = vpmaxsb_avx512vl(auVar33,auVar46);
              auVar67 = vmovdqa64_avx512f(auVar61);
              auVar67 = vpternlogd_avx512f(auVar67,auVar75,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar75,auVar67);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar33 = vpmovsdb_avx512f(auVar67);
              auVar41 = vpmaxsb_avx512vl(auVar33,auVar46);
              auVar67 = vmovdqa64_avx512f(auVar61);
              auVar67 = vpternlogd_avx512f(auVar67,auVar76,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar76,auVar67);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar33 = vpmovsdb_avx512f(auVar67);
              auVar42 = vpmaxsb_avx512vl(auVar33,auVar46);
              auVar67 = vmovdqa64_avx512f(auVar61);
              auVar67 = vpternlogd_avx512f(auVar67,auVar77,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar77,auVar67);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar33 = vpmovsdb_avx512f(auVar67);
              auVar43 = vpmaxsb_avx512vl(auVar33,auVar46);
              auVar67 = vmovdqa64_avx512f(auVar61);
              auVar67 = vpternlogd_avx512f(auVar67,auVar78,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar78,auVar67);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar33 = vpmovsdb_avx512f(auVar67);
              auVar44 = vpmaxsb_avx512vl(auVar33,auVar46);
              auVar67 = vmovdqa64_avx512f(auVar61);
              auVar67 = vpternlogd_avx512f(auVar67,auVar79,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar79,auVar67);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar33 = vpmovsdb_avx512f(auVar67);
              auVar33 = vpmaxsb_avx(auVar33,auVar46);
              auVar67 = vmovdqa64_avx512f(auVar61);
              auVar67 = vpternlogd_avx512f(auVar67,auVar80,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar80,auVar67);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar34 = vpmovsdb_avx512f(auVar67);
              auVar34 = vpmaxsb_avx(auVar34,auVar46);
              auVar67 = vmovdqa64_avx512f(auVar61);
              auVar67 = vpternlogd_avx512f(auVar67,auVar81,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar81,auVar67);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar35 = vpmovsdb_avx512f(auVar67);
              auVar35 = vpmaxsb_avx(auVar35,auVar46);
              auVar67 = vmovdqa64_avx512f(auVar61);
              auVar67 = vpternlogd_avx512f(auVar67,auVar82,auVar60,0xf8);
              auVar67 = vaddps_avx512f(auVar82,auVar67);
              auVar67 = vcvttps2dq_avx512f(auVar67);
              auVar36 = vpmovsdb_avx512f(auVar67);
              auVar36 = vpmaxsb_avx(auVar36,auVar46);
              auVar47 = vinserti32x4_avx512vl(ZEXT1632(auVar41),auVar33,1);
              in_ZMM15 = ZEXT3264(auVar47);
              auVar48 = vinserti32x4_avx512vl(ZEXT1632(auVar29),auVar38,1);
              auVar67 = vinserti64x4_avx512f(ZEXT3264(auVar48),auVar47,1);
              auVar47 = vinserti32x4_avx512vl(ZEXT1632(auVar42),auVar34,1);
              in_ZMM14 = ZEXT3264(auVar47);
              auVar48 = vinserti32x4_avx512vl(ZEXT1632(auVar30),auVar39,1);
              auVar68 = vinserti64x4_avx512f(ZEXT3264(auVar48),auVar47,1);
              auVar47 = vinserti32x4_avx512vl(ZEXT1632(auVar43),auVar35,1);
              in_ZMM13 = ZEXT3264(auVar47);
              auVar48 = vinserti32x4_avx512vl(ZEXT1632(auVar31),auVar37,1);
              auVar69 = vinserti64x4_avx512f(ZEXT3264(auVar48),auVar47,1);
              auVar47 = vinserti32x4_avx512vl(ZEXT1632(auVar44),auVar36,1);
              auVar48 = vinserti32x4_avx512vl(ZEXT1632(auVar32),auVar40,1);
              auVar70 = vinserti64x4_avx512f(ZEXT3264(auVar48),auVar47,1);
              auVar71 = vpunpcklwd_avx512bw(auVar67,auVar68);
              auVar67 = vpunpckhwd_avx512bw(auVar67,auVar68);
              auVar68 = vpunpcklwd_avx512bw(auVar69,auVar70);
              auVar69 = vpunpckhwd_avx512bw(auVar69,auVar70);
              auVar70 = vmovdqa64_avx512f(auVar71);
              auVar70 = vpermt2d_avx512f(auVar70,auVar64,auVar68);
              auVar68 = vpermt2d_avx512f(auVar71,auVar65,auVar68);
              auVar71 = vmovdqa64_avx512f(auVar67);
              auVar71 = vpermt2d_avx512f(auVar71,auVar64,auVar69);
              auVar69 = vpermt2d_avx512f(auVar67,auVar65,auVar69);
              auVar67 = vmovdqa64_avx512f(auVar70);
              *pauVar13 = auVar67;
              auVar67 = vmovdqa64_avx512f(auVar68);
              pauVar13[1] = auVar67;
              auVar67 = vmovdqa64_avx512f(auVar71);
              pauVar13[2] = auVar67;
              auVar67 = vmovdqa64_avx512f(auVar69);
              pauVar13[3] = auVar67;
              pauVar13 = pauVar13 + 4;
              iVar8 = iVar8 + 0x10;
              pauVar15 = (undefined1 (*) [64])(*pauVar17 + (long)(iVar20 << 4) * 4);
            } while (iVar8 < max_kk);
            pauVar15 = (undefined1 (*) [64])(*pauVar17 + (long)(iVar20 << 4) * 4);
          }
          auVar67 = vshufps_avx512f(auVar83,auVar83,0);
          in_ZMM9 = vshufps_avx512f(auVar83,auVar83,0x55);
          in_ZMM10 = vshufps_avx512f(auVar83,auVar83,0xaa);
          auVar68 = vshufps_avx512f(auVar83,auVar83,0xff);
          if ((iVar7 == 8) && (7 < max_kk)) {
            auVar69 = vshuff64x2_avx512f(auVar67,in_ZMM9,0);
            in_ZMM13 = vshuff64x2_avx512f(in_ZMM10,auVar68,0);
            in_ZMM14 = vshuff64x2_avx512f(auVar67,in_ZMM9,0x55);
            in_ZMM15 = vshuff64x2_avx512f(in_ZMM10,auVar68,0x55);
            auVar70 = vshuff64x2_avx512f(auVar67,in_ZMM9,0xaa);
            auVar71 = vshuff64x2_avx512f(in_ZMM10,auVar68,0xaa);
            auVar72 = vshuff64x2_avx512f(auVar67,in_ZMM9,0xff);
            auVar73 = vshuff64x2_avx512f(in_ZMM10,auVar68,0xff);
            iVar8 = 7;
            do {
              auVar74 = vmulps_avx512f(auVar69,*pauVar15);
              auVar75 = vmulps_avx512f(in_ZMM13,pauVar15[1]);
              auVar76 = vmulps_avx512f(in_ZMM14,pauVar15[2]);
              auVar77 = vmulps_avx512f(in_ZMM15,pauVar15[3]);
              auVar78 = vmulps_avx512f(auVar70,pauVar15[4]);
              auVar79 = vmulps_avx512f(auVar71,pauVar15[5]);
              auVar80 = vmulps_avx512f(auVar72,pauVar15[6]);
              auVar81 = vmulps_avx512f(auVar73,pauVar15[7]);
              auVar82 = vmovdqa64_avx512f(auVar61);
              auVar82 = vpternlogd_avx512f(auVar82,auVar74,auVar60,0xf8);
              auVar74 = vaddps_avx512f(auVar74,auVar82);
              auVar74 = vcvttps2dq_avx512f(auVar74);
              auVar29 = vpmovsdb_avx512f(auVar74);
              auVar29 = vpmaxsb_avx512vl(auVar29,auVar46);
              auVar74 = vmovdqa64_avx512f(auVar61);
              auVar74 = vpternlogd_avx512f(auVar74,auVar75,auVar60,0xf8);
              auVar74 = vaddps_avx512f(auVar75,auVar74);
              auVar74 = vcvttps2dq_avx512f(auVar74);
              auVar30 = vpmovsdb_avx512f(auVar74);
              auVar30 = vpmaxsb_avx512vl(auVar30,auVar46);
              auVar74 = vmovdqa64_avx512f(auVar61);
              auVar74 = vpternlogd_avx512f(auVar74,auVar76,auVar60,0xf8);
              auVar74 = vaddps_avx512f(auVar76,auVar74);
              auVar74 = vcvttps2dq_avx512f(auVar74);
              auVar31 = vpmovsdb_avx512f(auVar74);
              auVar31 = vpmaxsb_avx512vl(auVar31,auVar46);
              auVar74 = vmovdqa64_avx512f(auVar61);
              auVar74 = vpternlogd_avx512f(auVar74,auVar77,auVar60,0xf8);
              auVar74 = vaddps_avx512f(auVar77,auVar74);
              auVar74 = vcvttps2dq_avx512f(auVar74);
              auVar32 = vpmovsdb_avx512f(auVar74);
              auVar32 = vpmaxsb_avx512vl(auVar32,auVar46);
              auVar74 = vmovdqa64_avx512f(auVar61);
              auVar74 = vpternlogd_avx512f(auVar74,auVar78,auVar60,0xf8);
              auVar74 = vaddps_avx512f(auVar78,auVar74);
              auVar74 = vcvttps2dq_avx512f(auVar74);
              auVar33 = vpmovsdb_avx512f(auVar74);
              auVar33 = vpmaxsb_avx512vl(auVar33,auVar46);
              auVar74 = vmovdqa64_avx512f(auVar61);
              auVar74 = vpternlogd_avx512f(auVar74,auVar79,auVar60,0xf8);
              auVar74 = vaddps_avx512f(auVar79,auVar74);
              auVar74 = vcvttps2dq_avx512f(auVar74);
              auVar34 = vpmovsdb_avx512f(auVar74);
              auVar34 = vpmaxsb_avx512vl(auVar34,auVar46);
              auVar74 = vmovdqa64_avx512f(auVar61);
              auVar74 = vpternlogd_avx512f(auVar74,auVar80,auVar60,0xf8);
              auVar74 = vaddps_avx512f(auVar80,auVar74);
              auVar74 = vcvttps2dq_avx512f(auVar74);
              auVar35 = vpmovsdb_avx512f(auVar74);
              auVar35 = vpmaxsb_avx512vl(auVar35,auVar46);
              auVar74 = vmovdqa64_avx512f(auVar61);
              auVar74 = vpternlogd_avx512f(auVar74,auVar81,auVar60,0xf8);
              auVar74 = vaddps_avx512f(auVar81,auVar74);
              auVar74 = vcvttps2dq_avx512f(auVar74);
              auVar36 = vpmovsdb_avx512f(auVar74);
              auVar36 = vpmaxsb_avx512vl(auVar36,auVar46);
              auVar47 = vinserti32x4_avx512vl(ZEXT1632(auVar33),auVar35,1);
              auVar48 = vinserti32x4_avx512vl(ZEXT1632(auVar29),auVar31,1);
              auVar74 = vinserti64x4_avx512f(ZEXT3264(auVar48),auVar47,1);
              auVar47 = vinserti32x4_avx512vl(ZEXT1632(auVar34),auVar36,1);
              auVar48 = vinserti32x4_avx512vl(ZEXT1632(auVar30),auVar32,1);
              auVar75 = vinserti64x4_avx512f(ZEXT3264(auVar48),auVar47,1);
              auVar76 = vpunpcklwd_avx512bw(auVar74,auVar75);
              auVar74 = vpunpckhwd_avx512bw(auVar74,auVar75);
              auVar75 = vmovdqa64_avx512f(auVar76);
              auVar75 = vpermt2w_avx512bw(auVar75,auVar62,auVar74);
              auVar76 = vpermt2w_avx512bw(auVar76,auVar63,auVar74);
              auVar74 = vmovdqa64_avx512f(auVar75);
              *pauVar13 = auVar74;
              auVar74 = vmovdqa64_avx512f(auVar76);
              pauVar13[1] = auVar74;
              pauVar13 = pauVar13 + 2;
              pauVar15 = (undefined1 (*) [64])(*pauVar15 + (long)(iVar20 * 8) * 4);
              iVar8 = iVar8 + 8;
            } while (iVar8 < max_kk);
          }
          if ((iVar7 == 4) && (3 < max_kk)) {
            auVar69 = vshuff64x2_avx512f(auVar67,in_ZMM9,0x88);
            auVar70 = vshuff64x2_avx512f(in_ZMM10,auVar68,0x88);
            auVar67 = vshuff64x2_avx512f(auVar67,in_ZMM9,0xdd);
            auVar68 = vshuff64x2_avx512f(in_ZMM10,auVar68,0xdd);
            auVar71 = vshuff64x2_avx512f(auVar69,auVar70,0x88);
            in_ZMM9 = vshuff64x2_avx512f(auVar67,auVar68,0x88);
            in_ZMM10 = vshuff64x2_avx512f(auVar69,auVar70,0xdd);
            auVar67 = vshuff64x2_avx512f(auVar67,auVar68,0xdd);
            iVar8 = 3;
            do {
              auVar68 = vmulps_avx512f(auVar71,*pauVar15);
              auVar69 = vmulps_avx512f(in_ZMM9,pauVar15[1]);
              auVar70 = vmulps_avx512f(in_ZMM10,pauVar15[2]);
              auVar72 = vmulps_avx512f(auVar67,pauVar15[3]);
              auVar73 = vmovdqa64_avx512f(auVar61);
              auVar73 = vpternlogd_avx512f(auVar73,auVar68,auVar60,0xf8);
              auVar68 = vaddps_avx512f(auVar68,auVar73);
              auVar68 = vcvttps2dq_avx512f(auVar68);
              auVar29 = vpmovsdb_avx512f(auVar68);
              auVar29 = vpmaxsb_avx(auVar29,auVar46);
              auVar68 = vmovdqa64_avx512f(auVar61);
              auVar68 = vpternlogd_avx512f(auVar68,auVar69,auVar60,0xf8);
              auVar68 = vaddps_avx512f(auVar69,auVar68);
              auVar68 = vcvttps2dq_avx512f(auVar68);
              auVar30 = vpmovsdb_avx512f(auVar68);
              auVar30 = vpmaxsb_avx(auVar30,auVar46);
              auVar68 = vmovdqa64_avx512f(auVar61);
              auVar68 = vpternlogd_avx512f(auVar68,auVar70,auVar60,0xf8);
              auVar68 = vaddps_avx512f(auVar70,auVar68);
              auVar68 = vcvttps2dq_avx512f(auVar68);
              auVar31 = vpmovsdb_avx512f(auVar68);
              auVar31 = vpmaxsb_avx(auVar31,auVar46);
              auVar68 = vmovdqa64_avx512f(auVar61);
              auVar68 = vpternlogd_avx512f(auVar68,auVar72,auVar60,0xf8);
              auVar68 = vaddps_avx512f(auVar72,auVar68);
              auVar68 = vcvttps2dq_avx512f(auVar68);
              auVar32 = vpmovsdb_avx512f(auVar68);
              auVar32 = vpmaxsb_avx(auVar32,auVar46);
              in_ZMM15 = ZEXT1664(auVar32);
              auVar47._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar29;
              auVar47._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar31
              ;
              auVar49._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar30;
              auVar49._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar32
              ;
              auVar48 = vpunpcklwd_avx2(auVar47,auVar49);
              auVar47 = vpunpckhwd_avx2(auVar47,auVar49);
              auVar49 = vpunpcklwd_avx2(auVar48,auVar47);
              in_ZMM13 = ZEXT3264(auVar49);
              auVar47 = vpunpckhwd_avx2(auVar48,auVar47);
              auVar48 = vpunpcklwd_avx2(auVar49,auVar47);
              in_ZMM14 = ZEXT3264(auVar48);
              auVar47 = vpunpckhwd_avx2(auVar49,auVar47);
              *(undefined1 (*) [32])*pauVar13 = auVar48;
              *(undefined1 (*) [32])(*pauVar13 + 0x20) = auVar47;
              pauVar13 = pauVar13 + 1;
              pauVar15 = (undefined1 (*) [64])(*pauVar15 + (long)(iVar20 * 4) * 4);
              iVar8 = iVar8 + 4;
            } while (iVar8 < max_kk);
          }
          if (iVar7 == 1) {
            uVar18 = 0;
            if (1 < max_kk) {
              iVar8 = 1;
              do {
                auVar67 = vmulps_avx512f(auVar83,*pauVar15);
                auVar68 = vmulps_avx512f(auVar83,*(undefined1 (*) [64])(*pauVar15 + uVar21 * 4));
                auVar69 = vmovdqa64_avx512f(auVar61);
                auVar69 = vpternlogd_avx512f(auVar69,auVar67,auVar60,0xf8);
                auVar67 = vaddps_avx512f(auVar67,auVar69);
                auVar67 = vcvttps2dq_avx512f(auVar67);
                auVar29 = vpmovsdb_avx512f(auVar67);
                auVar29 = vpmaxsb_avx(auVar29,auVar46);
                auVar67 = vmovdqa64_avx512f(auVar61);
                auVar67 = vpternlogd_avx512f(auVar67,auVar68,auVar60,0xf8);
                auVar67 = vaddps_avx512f(auVar68,auVar67);
                auVar67 = vcvttps2dq_avx512f(auVar67);
                auVar30 = vpmovsdb_avx512f(auVar67);
                auVar30 = vpmaxsb_avx(auVar30,auVar46);
                in_ZMM9 = ZEXT1664(auVar30);
                auVar31 = vpunpcklbw_avx(auVar29,auVar30);
                in_ZMM10 = ZEXT1664(auVar31);
                auVar29 = vpunpckhbw_avx(auVar29,auVar30);
                *(undefined1 (*) [16])*pauVar13 = auVar31;
                *(undefined1 (*) [16])(*pauVar13 + 0x10) = auVar29;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
                pauVar15 = (undefined1 (*) [64])(*pauVar15 + (long)(iVar20 * 2) * 4);
                iVar8 = iVar8 + 2;
                uVar18 = local_70;
              } while (iVar8 < max_kk);
            }
            iVar8 = max_kk - uVar18;
            if (iVar8 != 0 && (int)uVar18 <= max_kk) {
              do {
                auVar67 = vmulps_avx512f(auVar83,*pauVar15);
                auVar68 = vmovdqa64_avx512f(auVar61);
                in_ZMM9 = vpternlogd_avx512f(auVar68,auVar67,auVar60,0xf8);
                auVar67 = vaddps_avx512f(auVar67,in_ZMM9);
                auVar67 = vcvttps2dq_avx512f(auVar67);
                auVar29 = vpmovsdb_avx512f(auVar67);
                auVar29 = vpmaxsb_avx(auVar29,auVar46);
                *(undefined1 (*) [16])*pauVar13 = auVar29;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
                pauVar15 = (undefined1 (*) [64])(*pauVar15 + uVar21 * 4);
                iVar8 = iVar8 + -1;
              } while (iVar8 != 0);
            }
          }
          puVar27 = puVar26 + 4;
          uVar24 = (long)puVar26 + 0x1f;
          lVar22 = lVar22 + lVar23 * 0x40;
          puVar26 = puVar27;
        } while (uVar24 < (uint)max_ii);
      }
      auVar46 = _DAT_00601920;
      if ((int)((uint)puVar27 | 7) < max_ii) {
        lVar22 = (long)(iVar20 * k) * 4 +
                 ((long)puVar14 + (long)((ulong)puVar27 & 0xffffffff)) * lVar23 * 4;
        auVar48._8_4_ = 0x80000000;
        auVar48._0_8_ = 0x8000000080000000;
        auVar48._12_4_ = 0x80000000;
        auVar48._16_4_ = 0x80000000;
        auVar48._20_4_ = 0x80000000;
        auVar48._24_4_ = 0x80000000;
        auVar48._28_4_ = 0x80000000;
        auVar57._8_4_ = 0x3f000000;
        auVar57._0_8_ = 0x3f0000003f000000;
        auVar57._12_4_ = 0x3f000000;
        auVar57._16_4_ = 0x3f000000;
        auVar57._20_4_ = 0x3f000000;
        auVar57._24_4_ = 0x3f000000;
        auVar57._28_4_ = 0x3f000000;
        auVar58._8_2_ = 0x7f;
        auVar58._0_8_ = 0x7f007f007f007f;
        auVar58._10_2_ = 0x7f;
        auVar58._12_2_ = 0x7f;
        auVar58._14_2_ = 0x7f;
        auVar58._16_2_ = 0x7f;
        auVar58._18_2_ = 0x7f;
        auVar58._20_2_ = 0x7f;
        auVar58._22_2_ = 0x7f;
        auVar58._24_2_ = 0x7f;
        auVar58._26_2_ = 0x7f;
        auVar58._28_2_ = 0x7f;
        auVar58._30_2_ = 0x7f;
        auVar59._8_2_ = 0xff81;
        auVar59._0_8_ = 0xff81ff81ff81ff81;
        auVar59._10_2_ = 0xff81;
        auVar59._12_2_ = 0xff81;
        auVar59._14_2_ = 0xff81;
        auVar59._16_2_ = 0xff81;
        auVar59._18_2_ = 0xff81;
        auVar59._20_2_ = 0xff81;
        auVar59._22_2_ = 0xff81;
        auVar59._24_2_ = 0xff81;
        auVar59._26_2_ = 0xff81;
        auVar59._28_2_ = 0xff81;
        auVar59._30_2_ = 0xff81;
        auVar29[8] = 0x81;
        auVar29._0_8_ = 0x8181818181818181;
        auVar29[9] = 0x81;
        auVar29[10] = 0x81;
        auVar29[0xb] = 0x81;
        auVar29[0xc] = 0x81;
        auVar29[0xd] = 0x81;
        auVar29[0xe] = 0x81;
        auVar29[0xf] = 0x81;
        auVar60 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar61 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
        puVar26 = (uint *)((ulong)puVar27 & 0xffffffff);
        do {
          lVar25 = (long)puVar26 + (long)puVar14;
          auVar47 = *(undefined1 (*) [32])
                     ((long)scales->data + (long)puVar26 * 4 + (long)puVar14 * 4);
          if (max_kk < 0x10 || iVar7 != 0x10) {
            pfVar16 = (float *)((long)A->data + lVar25 * lVar23 * 4 + (long)(iVar20 * k) * 4);
          }
          else {
            iVar8 = 0xf;
            pauVar15 = (undefined1 (*) [64])((long)A->data + lVar22);
            do {
              pauVar17 = pauVar15;
              pvVar3 = scales->data;
              auVar62 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4)));
              auVar62 = vmulps_avx512f(auVar62,*pauVar17);
              auVar63 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 4)));
              auVar63 = vmulps_avx512f(auVar63,pauVar17[1]);
              auVar64 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 8)));
              auVar64 = vmulps_avx512f(auVar64,pauVar17[2]);
              auVar65 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0xc)));
              auVar65 = vmulps_avx512f(auVar65,pauVar17[3]);
              auVar83 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x10)));
              auVar83 = vmulps_avx512f(auVar83,pauVar17[4]);
              auVar67 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x14)));
              auVar67 = vmulps_avx512f(auVar67,pauVar17[5]);
              auVar68 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x18)));
              auVar68 = vmulps_avx512f(auVar68,pauVar17[6]);
              auVar69 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x1c)));
              auVar69 = vmulps_avx512f(auVar69,pauVar17[7]);
              auVar70 = vmovdqa64_avx512f(auVar61);
              auVar70 = vpternlogd_avx512f(auVar70,auVar62,auVar60,0xf8);
              auVar62 = vaddps_avx512f(auVar62,auVar70);
              auVar62 = vcvttps2dq_avx512f(auVar62);
              auVar30 = vpmovsdb_avx512f(auVar62);
              auVar30 = vpmaxsb_avx(auVar30,auVar29);
              auVar62 = vmovdqa64_avx512f(auVar61);
              auVar62 = vpternlogd_avx512f(auVar62,auVar63,auVar60,0xf8);
              auVar62 = vaddps_avx512f(auVar63,auVar62);
              auVar62 = vcvttps2dq_avx512f(auVar62);
              auVar31 = vpmovsdb_avx512f(auVar62);
              auVar31 = vpmaxsb_avx(auVar31,auVar29);
              auVar62 = vmovdqa64_avx512f(auVar61);
              auVar62 = vpternlogd_avx512f(auVar62,auVar64,auVar60,0xf8);
              auVar62 = vaddps_avx512f(auVar64,auVar62);
              auVar62 = vcvttps2dq_avx512f(auVar62);
              auVar32 = vpmovsdb_avx512f(auVar62);
              auVar32 = vpmaxsb_avx(auVar32,auVar29);
              auVar62 = vmovdqa64_avx512f(auVar61);
              auVar62 = vpternlogd_avx512f(auVar62,auVar65,auVar60,0xf8);
              auVar62 = vaddps_avx512f(auVar65,auVar62);
              auVar62 = vcvttps2dq_avx512f(auVar62);
              auVar33 = vpmovsdb_avx512f(auVar62);
              auVar33 = vpmaxsb_avx(auVar33,auVar29);
              auVar62 = vmovdqa64_avx512f(auVar61);
              auVar62 = vpternlogd_avx512f(auVar62,auVar83,auVar60,0xf8);
              auVar62 = vaddps_avx512f(auVar83,auVar62);
              auVar62 = vcvttps2dq_avx512f(auVar62);
              auVar34 = vpmovsdb_avx512f(auVar62);
              auVar34 = vpmaxsb_avx(auVar34,auVar29);
              auVar62 = vmovdqa64_avx512f(auVar61);
              auVar62 = vpternlogd_avx512f(auVar62,auVar67,auVar60,0xf8);
              auVar62 = vaddps_avx512f(auVar67,auVar62);
              auVar62 = vcvttps2dq_avx512f(auVar62);
              auVar35 = vpmovsdb_avx512f(auVar62);
              auVar35 = vpmaxsb_avx(auVar35,auVar29);
              auVar62 = vmovdqa64_avx512f(auVar61);
              auVar62 = vpternlogd_avx512f(auVar62,auVar68,auVar60,0xf8);
              auVar62 = vaddps_avx512f(auVar68,auVar62);
              auVar62 = vcvttps2dq_avx512f(auVar62);
              auVar36 = vpmovsdb_avx512f(auVar62);
              auVar36 = vpmaxsb_avx(auVar36,auVar29);
              auVar62 = vmovdqa64_avx512f(auVar61);
              auVar62 = vpternlogd_avx512f(auVar62,auVar69,auVar60,0xf8);
              auVar62 = vaddps_avx512f(auVar69,auVar62);
              auVar62 = vcvttps2dq_avx512f(auVar62);
              auVar38 = vpmovsdb_avx512f(auVar62);
              auVar39 = vpmaxsb_avx512vl(auVar38,auVar29);
              auVar37 = vpunpcklwd_avx512vl(auVar30,auVar31);
              auVar30 = vpunpckhwd_avx(auVar30,auVar31);
              auVar38 = vpunpcklwd_avx(auVar32,auVar33);
              auVar31 = vpunpckhwd_avx(auVar32,auVar33);
              auVar33 = vpunpcklwd_avx(auVar34,auVar35);
              auVar32 = vpunpckhwd_avx(auVar34,auVar35);
              auVar35 = vpunpcklwd_avx512vl(auVar36,auVar39);
              auVar36 = vpunpckhwd_avx512vl(auVar36,auVar39);
              auVar39 = vpunpckldq_avx512vl(auVar37,auVar38);
              auVar38 = vpunpckhdq_avx512vl(auVar37,auVar38);
              auVar37 = vpunpckldq_avx512vl(auVar30,auVar31);
              auVar30 = vpunpckhdq_avx(auVar30,auVar31);
              auVar34 = vpunpckldq_avx(auVar33,auVar35);
              auVar31 = vpunpckhdq_avx(auVar33,auVar35);
              auVar33 = vpunpckldq_avx(auVar32,auVar36);
              auVar32 = vpunpckhdq_avx(auVar32,auVar36);
              in_ZMM13 = ZEXT1664(auVar32);
              auVar35 = vpunpcklqdq_avx512vl(auVar39,auVar34);
              in_ZMM15 = ZEXT1664(auVar35);
              auVar34 = vpunpckhqdq_avx512vl(auVar39,auVar34);
              auVar36 = vpunpcklqdq_avx512vl(auVar38,auVar31);
              auVar31 = vpunpckhqdq_avx(auVar38,auVar31);
              auVar38 = vpunpcklqdq_avx512vl(auVar37,auVar33);
              auVar33 = vpunpckhqdq_avx512vl(auVar37,auVar33);
              in_ZMM14 = ZEXT1664(auVar33);
              auVar39 = vpunpcklqdq_avx512vl(auVar30,auVar32);
              auVar30 = vpunpckhqdq_avx(auVar30,auVar32);
              auVar49 = vinserti32x4_avx512vl(ZEXT1632(auVar36),auVar31,1);
              in_ZMM10 = vinserti64x4_avx512f
                                   (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar34,
                                                        ZEXT116(0) * auVar34 + ZEXT116(1) * auVar35)
                                            ),auVar49,1);
              auVar49 = vinserti32x4_avx512vl(ZEXT1632(auVar39),auVar30,1);
              in_ZMM9 = vinserti64x4_avx512f
                                  (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar33,
                                                       ZEXT116(0) * auVar33 + ZEXT116(1) * auVar38))
                                   ,auVar49,1);
              auVar62 = vmovdqa64_avx512f(in_ZMM10);
              *pauVar13 = auVar62;
              auVar62 = vmovdqa64_avx512f(in_ZMM9);
              pauVar13[1] = auVar62;
              pauVar13 = pauVar13 + 2;
              iVar8 = iVar8 + 0x10;
              pauVar15 = (undefined1 (*) [64])(*pauVar17 + (long)(iVar20 << 4) * 4);
            } while (iVar8 < max_kk);
            pfVar16 = (float *)(*pauVar17 + (long)(iVar20 << 4) * 4);
          }
          if (7 < max_kk && iVar7 == 8) {
            iVar8 = 7;
            do {
              pvVar3 = scales->data;
              fVar98 = *(float *)((long)pvVar3 + lVar25 * 4);
              auVar52._4_4_ = fVar98 * pfVar16[1];
              auVar52._0_4_ = fVar98 * *pfVar16;
              auVar52._8_4_ = fVar98 * pfVar16[2];
              auVar52._12_4_ = fVar98 * pfVar16[3];
              auVar52._16_4_ = fVar98 * pfVar16[4];
              auVar52._20_4_ = fVar98 * pfVar16[5];
              auVar52._24_4_ = fVar98 * pfVar16[6];
              auVar52._28_4_ = fVar98;
              fVar98 = *(float *)((long)pvVar3 + lVar25 * 4 + 4);
              auVar53._4_4_ = fVar98 * pfVar16[9];
              auVar53._0_4_ = fVar98 * pfVar16[8];
              auVar53._8_4_ = fVar98 * pfVar16[10];
              auVar53._12_4_ = fVar98 * pfVar16[0xb];
              auVar53._16_4_ = fVar98 * pfVar16[0xc];
              auVar53._20_4_ = fVar98 * pfVar16[0xd];
              auVar53._24_4_ = fVar98 * pfVar16[0xe];
              auVar53._28_4_ = fVar98;
              fVar101 = *(float *)((long)pvVar3 + lVar25 * 4 + 8);
              auVar54._4_4_ = fVar101 * pfVar16[0x11];
              auVar54._0_4_ = fVar101 * pfVar16[0x10];
              auVar54._8_4_ = fVar101 * pfVar16[0x12];
              auVar54._12_4_ = fVar101 * pfVar16[0x13];
              auVar54._16_4_ = fVar101 * pfVar16[0x14];
              auVar54._20_4_ = fVar101 * pfVar16[0x15];
              auVar54._24_4_ = fVar101 * pfVar16[0x16];
              auVar54._28_4_ = fVar101;
              fVar101 = *(float *)((long)pvVar3 + lVar25 * 4 + 0xc);
              auVar4._4_4_ = fVar101 * pfVar16[0x19];
              auVar4._0_4_ = fVar101 * pfVar16[0x18];
              auVar4._8_4_ = fVar101 * pfVar16[0x1a];
              auVar4._12_4_ = fVar101 * pfVar16[0x1b];
              auVar4._16_4_ = fVar101 * pfVar16[0x1c];
              auVar4._20_4_ = fVar101 * pfVar16[0x1d];
              auVar4._24_4_ = fVar101 * pfVar16[0x1e];
              auVar4._28_4_ = fVar101;
              fVar101 = *(float *)((long)pvVar3 + lVar25 * 4 + 0x10);
              auVar5._4_4_ = fVar101 * pfVar16[0x21];
              auVar5._0_4_ = fVar101 * pfVar16[0x20];
              auVar5._8_4_ = fVar101 * pfVar16[0x22];
              auVar5._12_4_ = fVar101 * pfVar16[0x23];
              auVar5._16_4_ = fVar101 * pfVar16[0x24];
              auVar5._20_4_ = fVar101 * pfVar16[0x25];
              auVar5._24_4_ = fVar101 * pfVar16[0x26];
              auVar5._28_4_ = fVar101;
              in_ZMM13 = ZEXT3264(auVar5);
              fVar102 = *(float *)((long)pvVar3 + lVar25 * 4 + 0x14);
              auVar56._4_4_ = fVar102 * pfVar16[0x29];
              auVar56._0_4_ = fVar102 * pfVar16[0x28];
              auVar56._8_4_ = fVar102 * pfVar16[0x2a];
              auVar56._12_4_ = fVar102 * pfVar16[0x2b];
              auVar56._16_4_ = fVar102 * pfVar16[0x2c];
              auVar56._20_4_ = fVar102 * pfVar16[0x2d];
              auVar56._24_4_ = fVar102 * pfVar16[0x2e];
              auVar56._28_4_ = fVar102;
              in_ZMM14 = ZEXT3264(auVar56);
              fVar103 = *(float *)((long)pvVar3 + lVar25 * 4 + 0x18);
              auVar55._4_4_ = fVar103 * pfVar16[0x31];
              auVar55._0_4_ = fVar103 * pfVar16[0x30];
              auVar55._8_4_ = fVar103 * pfVar16[0x32];
              auVar55._12_4_ = fVar103 * pfVar16[0x33];
              auVar55._16_4_ = fVar103 * pfVar16[0x34];
              auVar55._20_4_ = fVar103 * pfVar16[0x35];
              auVar55._24_4_ = fVar103 * pfVar16[0x36];
              auVar55._28_4_ = fVar103;
              in_ZMM15 = ZEXT3264(auVar55);
              auVar49 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)pvVar3 + lVar25 * 4 + 0x1c)));
              auVar50 = vmulps_avx512vl(auVar49,*(undefined1 (*) [32])(pfVar16 + 0x38));
              auVar49 = vmovdqa64_avx512vl(auVar57);
              auVar49 = vpternlogd_avx512vl(auVar49,auVar52,auVar48,0xf8);
              auVar51 = vmovdqa64_avx512vl(auVar57);
              auVar51 = vpternlogd_avx512vl(auVar51,auVar54,auVar48,0xf8);
              auVar49 = vaddps_avx512vl(auVar52,auVar49);
              auVar52 = vaddps_avx512vl(auVar54,auVar51);
              auVar51._0_4_ = (int)auVar49._0_4_;
              auVar51._4_4_ = (int)auVar49._4_4_;
              auVar51._8_4_ = (int)auVar49._8_4_;
              auVar51._12_4_ = (int)auVar49._12_4_;
              auVar51._16_4_ = (int)auVar49._16_4_;
              auVar51._20_4_ = (int)auVar49._20_4_;
              auVar51._24_4_ = (int)auVar49._24_4_;
              auVar51._28_4_ = (int)auVar49._28_4_;
              auVar116._0_4_ = (int)auVar52._0_4_;
              auVar116._4_4_ = (int)auVar52._4_4_;
              auVar116._8_4_ = (int)auVar52._8_4_;
              auVar116._12_4_ = (int)auVar52._12_4_;
              auVar116._16_4_ = (int)auVar52._16_4_;
              auVar116._20_4_ = (int)auVar52._20_4_;
              auVar116._24_4_ = (int)auVar52._24_4_;
              auVar116._28_4_ = (int)auVar52._28_4_;
              auVar49 = vpackssdw_avx2(auVar51,auVar116);
              auVar49 = vpermq_avx2(auVar49,0xd8);
              auVar49 = vpminsw_avx2(auVar49,auVar58);
              auVar52 = vpmaxsw_avx2(auVar49,auVar59);
              auVar49 = vpternlogd_avx512vl(auVar57,auVar53,auVar48,0xf8);
              auVar53 = vmovdqa64_avx512vl(auVar57);
              auVar53 = vpternlogd_avx512vl(auVar53,auVar4,auVar48,0xf8);
              auVar53 = vaddps_avx512vl(auVar4,auVar53);
              auVar113._0_4_ = (int)(fVar98 * pfVar16[8] + auVar49._0_4_);
              auVar113._4_4_ = (int)(fVar98 * pfVar16[9] + auVar49._4_4_);
              auVar113._8_4_ = (int)(fVar98 * pfVar16[10] + auVar49._8_4_);
              auVar113._12_4_ = (int)(fVar98 * pfVar16[0xb] + auVar49._12_4_);
              auVar113._16_4_ = (int)(fVar98 * pfVar16[0xc] + auVar49._16_4_);
              auVar113._20_4_ = (int)(fVar98 * pfVar16[0xd] + auVar49._20_4_);
              auVar113._24_4_ = (int)(fVar98 * pfVar16[0xe] + auVar49._24_4_);
              auVar113._28_4_ = (int)(fVar98 + auVar49._28_4_);
              auVar117._0_4_ = (int)auVar53._0_4_;
              auVar117._4_4_ = (int)auVar53._4_4_;
              auVar117._8_4_ = (int)auVar53._8_4_;
              auVar117._12_4_ = (int)auVar53._12_4_;
              auVar117._16_4_ = (int)auVar53._16_4_;
              auVar117._20_4_ = (int)auVar53._20_4_;
              auVar117._24_4_ = (int)auVar53._24_4_;
              auVar117._28_4_ = (int)auVar53._28_4_;
              auVar49 = vpackssdw_avx2(auVar113,auVar117);
              auVar49 = vpermq_avx2(auVar49,0xd8);
              auVar49 = vpminsw_avx2(auVar49,auVar58);
              auVar53 = vpmaxsw_avx2(auVar49,auVar59);
              auVar49 = vpternlogd_avx512vl(auVar57,auVar5,auVar48,0xf8);
              auVar54 = vpternlogd_avx512vl(auVar57,auVar55,auVar48,0xf8);
              auVar118._0_4_ = (int)(fVar101 * pfVar16[0x20] + auVar49._0_4_);
              auVar118._4_4_ = (int)(fVar101 * pfVar16[0x21] + auVar49._4_4_);
              auVar118._8_4_ = (int)(fVar101 * pfVar16[0x22] + auVar49._8_4_);
              auVar118._12_4_ = (int)(fVar101 * pfVar16[0x23] + auVar49._12_4_);
              auVar118._16_4_ = (int)(fVar101 * pfVar16[0x24] + auVar49._16_4_);
              auVar118._20_4_ = (int)(fVar101 * pfVar16[0x25] + auVar49._20_4_);
              auVar118._24_4_ = (int)(fVar101 * pfVar16[0x26] + auVar49._24_4_);
              auVar118._28_4_ = (int)(fVar101 + auVar49._28_4_);
              auVar120._0_4_ = (int)(fVar103 * pfVar16[0x30] + auVar54._0_4_);
              auVar120._4_4_ = (int)(fVar103 * pfVar16[0x31] + auVar54._4_4_);
              auVar120._8_4_ = (int)(fVar103 * pfVar16[0x32] + auVar54._8_4_);
              auVar120._12_4_ = (int)(fVar103 * pfVar16[0x33] + auVar54._12_4_);
              auVar120._16_4_ = (int)(fVar103 * pfVar16[0x34] + auVar54._16_4_);
              auVar120._20_4_ = (int)(fVar103 * pfVar16[0x35] + auVar54._20_4_);
              auVar120._24_4_ = (int)(fVar103 * pfVar16[0x36] + auVar54._24_4_);
              auVar120._28_4_ = (int)(fVar103 + auVar54._28_4_);
              auVar49 = vpackssdw_avx2(auVar118,auVar120);
              auVar49 = vpermq_avx2(auVar49,0xd8);
              auVar49 = vpminsw_avx2(auVar49,auVar58);
              auVar49 = vpmaxsw_avx2(auVar49,auVar59);
              auVar49 = vpacksswb_avx2(auVar52,auVar49);
              auVar52 = vpternlogd_avx512vl(auVar57,auVar56,auVar48,0xf8);
              auVar54 = vpternlogd_avx512vl(auVar57,auVar50,auVar48,0xf8);
              auVar54 = vaddps_avx512vl(auVar50,auVar54);
              auVar50._0_4_ = (int)(fVar102 * pfVar16[0x28] + auVar52._0_4_);
              auVar50._4_4_ = (int)(fVar102 * pfVar16[0x29] + auVar52._4_4_);
              auVar50._8_4_ = (int)(fVar102 * pfVar16[0x2a] + auVar52._8_4_);
              auVar50._12_4_ = (int)(fVar102 * pfVar16[0x2b] + auVar52._12_4_);
              auVar50._16_4_ = (int)(fVar102 * pfVar16[0x2c] + auVar52._16_4_);
              auVar50._20_4_ = (int)(fVar102 * pfVar16[0x2d] + auVar52._20_4_);
              auVar50._24_4_ = (int)(fVar102 * pfVar16[0x2e] + auVar52._24_4_);
              auVar50._28_4_ = (int)(fVar102 + auVar52._28_4_);
              auVar121._0_4_ = (int)auVar54._0_4_;
              auVar121._4_4_ = (int)auVar54._4_4_;
              auVar121._8_4_ = (int)auVar54._8_4_;
              auVar121._12_4_ = (int)auVar54._12_4_;
              auVar121._16_4_ = (int)auVar54._16_4_;
              auVar121._20_4_ = (int)auVar54._20_4_;
              auVar121._24_4_ = (int)auVar54._24_4_;
              auVar121._28_4_ = (int)auVar54._28_4_;
              auVar52 = vpackssdw_avx2(auVar50,auVar121);
              auVar52 = vpermq_avx2(auVar52,0xd8);
              auVar52 = vpminsw_avx2(auVar52,auVar58);
              auVar52 = vpmaxsw_avx2(auVar52,auVar59);
              auVar52 = vpacksswb_avx2(auVar53,auVar52);
              auVar49 = vpermq_avx2(auVar49,0xd8);
              auVar53 = vpermq_avx2(auVar52,0xd8);
              auVar52 = vpunpcklwd_avx2(auVar49,auVar53);
              auVar49 = vpunpckhwd_avx2(auVar49,auVar53);
              auVar53 = vpunpckldq_avx2(auVar52,auVar49);
              auVar53 = vpermq_avx2(auVar53,0xd8);
              in_ZMM10 = ZEXT3264(auVar53);
              auVar49 = vpunpckhdq_avx2(auVar52,auVar49);
              auVar49 = vpermq_avx2(auVar49,0xd8);
              in_ZMM9 = ZEXT3264(auVar49);
              *(undefined1 (*) [32])*pauVar13 = auVar53;
              *(undefined1 (*) [32])(*pauVar13 + 0x20) = auVar49;
              pauVar13 = pauVar13 + 1;
              pfVar16 = pfVar16 + iVar20 * 8;
              iVar8 = iVar8 + 8;
            } while (iVar8 < max_kk);
          }
          if ((iVar7 == 4) && (3 < max_kk)) {
            auVar49 = vshufps_avx(auVar47,auVar47,0);
            auVar52 = vshufps_avx(auVar47,auVar47,0x55);
            auVar53 = vshufps_avx(auVar47,auVar47,0xaa);
            in_ZMM13 = ZEXT3264(auVar53);
            auVar54 = vshufps_avx(auVar47,auVar47,0xff);
            in_ZMM14 = ZEXT3264(auVar54);
            in_ZMM9 = ZEXT3264(CONCAT1616(auVar52._0_16_,auVar49._0_16_));
            in_ZMM10 = ZEXT3264(CONCAT1616(auVar54._0_16_,auVar53._0_16_));
            auVar4 = vperm2f128_avx(auVar49,auVar52,0x31);
            auVar5 = vperm2f128_avx(auVar53,auVar54,0x31);
            iVar8 = 3;
            do {
              auVar62._0_4_ = auVar49._0_4_ * *pfVar16;
              auVar62._4_4_ = auVar49._4_4_ * pfVar16[1];
              auVar62._8_4_ = auVar49._8_4_ * pfVar16[2];
              auVar62._12_4_ = auVar49._12_4_ * pfVar16[3];
              auVar62._16_4_ = auVar52._0_4_ * pfVar16[4];
              auVar62._20_4_ = auVar52._4_4_ * pfVar16[5];
              auVar62._28_36_ = in_ZMM13._28_36_;
              auVar62._24_4_ = auVar52._8_4_ * pfVar16[6];
              auVar63._0_4_ = auVar53._0_4_ * pfVar16[8];
              auVar63._4_4_ = auVar53._4_4_ * pfVar16[9];
              auVar63._8_4_ = auVar53._8_4_ * pfVar16[10];
              auVar63._12_4_ = auVar53._12_4_ * pfVar16[0xb];
              auVar63._16_4_ = auVar54._0_4_ * pfVar16[0xc];
              auVar63._20_4_ = auVar54._4_4_ * pfVar16[0xd];
              auVar63._28_36_ = in_ZMM14._28_36_;
              auVar63._24_4_ = auVar54._8_4_ * pfVar16[0xe];
              auVar64._0_4_ = auVar4._0_4_ * pfVar16[0x10];
              auVar64._4_4_ = auVar4._4_4_ * pfVar16[0x11];
              auVar64._8_4_ = auVar4._8_4_ * pfVar16[0x12];
              auVar64._12_4_ = auVar4._12_4_ * pfVar16[0x13];
              auVar64._16_4_ = auVar4._16_4_ * pfVar16[0x14];
              auVar64._20_4_ = auVar4._20_4_ * pfVar16[0x15];
              auVar64._28_36_ = in_ZMM15._28_36_;
              auVar64._24_4_ = auVar4._24_4_ * pfVar16[0x16];
              auVar55 = vmulps_avx512vl(auVar5,*(undefined1 (*) [32])(pfVar16 + 0x18));
              auVar56 = vmovdqa64_avx512vl(auVar57);
              auVar56 = vpternlogd_avx512vl(auVar56,auVar62._0_32_,auVar48,0xf8);
              auVar50 = vmovdqa64_avx512vl(auVar57);
              auVar50 = vpternlogd_avx512vl(auVar50,auVar63._0_32_,auVar48,0xf8);
              auVar56 = vaddps_avx512vl(auVar62._0_32_,auVar56);
              auVar50 = vaddps_avx512vl(auVar63._0_32_,auVar50);
              auVar129._0_4_ = (int)auVar56._0_4_;
              auVar129._4_4_ = (int)auVar56._4_4_;
              auVar129._8_4_ = (int)auVar56._8_4_;
              auVar129._12_4_ = (int)auVar56._12_4_;
              auVar129._16_4_ = (int)auVar56._16_4_;
              auVar129._20_4_ = (int)auVar56._20_4_;
              auVar129._24_4_ = (int)auVar56._24_4_;
              auVar129._28_4_ = (int)auVar56._28_4_;
              auVar135._0_4_ = (int)auVar50._0_4_;
              auVar135._4_4_ = (int)auVar50._4_4_;
              auVar135._8_4_ = (int)auVar50._8_4_;
              auVar135._12_4_ = (int)auVar50._12_4_;
              auVar135._16_4_ = (int)auVar50._16_4_;
              auVar135._20_4_ = (int)auVar50._20_4_;
              auVar135._24_4_ = (int)auVar50._24_4_;
              auVar135._28_4_ = (int)auVar50._28_4_;
              auVar56 = vpackssdw_avx2(auVar129,auVar135);
              auVar56 = vpermq_avx2(auVar56,0xd8);
              auVar56 = vpminsw_avx2(auVar56,auVar58);
              auVar56 = vpmaxsw_avx2(auVar56,auVar59);
              auVar30 = vpacksswb_avx(auVar56._0_16_,auVar56._16_16_);
              auVar56 = vpternlogd_avx512vl(auVar57,auVar64._0_32_,auVar48,0xf8);
              auVar50 = vmovdqa64_avx512vl(auVar57);
              auVar50 = vpternlogd_avx512vl(auVar50,auVar55,auVar48,0xf8);
              auVar55 = vaddps_avx512vl(auVar55,auVar50);
              auVar136._0_4_ = (int)(auVar64._0_4_ + auVar56._0_4_);
              auVar136._4_4_ = (int)(auVar64._4_4_ + auVar56._4_4_);
              auVar136._8_4_ = (int)(auVar64._8_4_ + auVar56._8_4_);
              auVar136._12_4_ = (int)(auVar64._12_4_ + auVar56._12_4_);
              auVar136._16_4_ = (int)(auVar64._16_4_ + auVar56._16_4_);
              auVar136._20_4_ = (int)(auVar64._20_4_ + auVar56._20_4_);
              auVar136._24_4_ = (int)(auVar64._24_4_ + auVar56._24_4_);
              auVar136._28_4_ = (int)(in_ZMM15._28_4_ + auVar56._28_4_);
              auVar141._0_4_ = (int)auVar55._0_4_;
              auVar141._4_4_ = (int)auVar55._4_4_;
              auVar141._8_4_ = (int)auVar55._8_4_;
              auVar141._12_4_ = (int)auVar55._12_4_;
              auVar141._16_4_ = (int)auVar55._16_4_;
              auVar141._20_4_ = (int)auVar55._20_4_;
              auVar141._24_4_ = (int)auVar55._24_4_;
              auVar141._28_4_ = (int)auVar55._28_4_;
              auVar56 = vpackssdw_avx2(auVar136,auVar141);
              auVar56 = vpermq_avx2(auVar56,0xd8);
              auVar56 = vpminsw_avx2(auVar56,auVar58);
              auVar56 = vpmaxsw_avx2(auVar56,auVar59);
              auVar31 = vpacksswb_avx(auVar56._0_16_,auVar56._16_16_);
              in_ZMM14 = ZEXT1664(auVar31);
              auVar32 = vpunpcklwd_avx(auVar30,auVar31);
              auVar33 = vpunpckhwd_avx512vl(auVar30,auVar31);
              auVar34 = vpunpcklwd_avx512vl(auVar32,auVar33);
              auVar32 = vpunpckhwd_avx512vl(auVar32,auVar33);
              auVar32 = vpunpckhwd_avx512vl(auVar34,auVar32);
              in_ZMM15 = ZEXT1664(auVar32);
              auVar130._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar30;
              auVar130._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar31;
              in_ZMM13 = ZEXT3264(auVar130);
              auVar30 = vpmovdw_avx512vl(auVar130);
              *(undefined1 (*) [16])*pauVar13 = auVar30;
              *(undefined1 (*) [16])(*pauVar13 + 0x10) = auVar32;
              pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
              pfVar16 = pfVar16 + iVar20 * 4;
              iVar8 = iVar8 + 4;
            } while (iVar8 < max_kk);
          }
          if (iVar7 == 1) {
            fVar98 = auVar47._0_4_;
            fVar101 = auVar47._4_4_;
            fVar102 = auVar47._8_4_;
            fVar103 = auVar47._12_4_;
            fVar104 = auVar47._16_4_;
            fVar105 = auVar47._20_4_;
            fVar106 = auVar47._24_4_;
            uVar18 = 0;
            if (1 < max_kk) {
              iVar8 = 1;
              do {
                auVar65._0_4_ = fVar98 * *pfVar16;
                auVar65._4_4_ = fVar101 * pfVar16[1];
                auVar65._8_4_ = fVar102 * pfVar16[2];
                auVar65._12_4_ = fVar103 * pfVar16[3];
                auVar65._16_4_ = fVar104 * pfVar16[4];
                auVar65._20_4_ = fVar105 * pfVar16[5];
                auVar65._28_36_ = in_ZMM9._28_36_;
                auVar65._24_4_ = fVar106 * pfVar16[6];
                pfVar1 = pfVar16 + uVar21;
                auVar83._0_4_ = fVar98 * *pfVar1;
                auVar83._4_4_ = fVar101 * pfVar1[1];
                auVar83._8_4_ = fVar102 * pfVar1[2];
                auVar83._12_4_ = fVar103 * pfVar1[3];
                auVar83._16_4_ = fVar104 * pfVar1[4];
                auVar83._20_4_ = fVar105 * pfVar1[5];
                auVar83._28_36_ = in_ZMM10._28_36_;
                auVar83._24_4_ = fVar106 * pfVar1[6];
                auVar47 = vpternlogd_avx512vl(auVar57,auVar65._0_32_,auVar48,0xf8);
                auVar49 = vpternlogd_avx512vl(auVar57,auVar83._0_32_,auVar48,0xf8);
                auVar109._0_4_ = (int)(auVar65._0_4_ + auVar47._0_4_);
                auVar109._4_4_ = (int)(auVar65._4_4_ + auVar47._4_4_);
                auVar109._8_4_ = (int)(auVar65._8_4_ + auVar47._8_4_);
                auVar109._12_4_ = (int)(auVar65._12_4_ + auVar47._12_4_);
                auVar109._16_4_ = (int)(auVar65._16_4_ + auVar47._16_4_);
                auVar109._20_4_ = (int)(auVar65._20_4_ + auVar47._20_4_);
                auVar109._24_4_ = (int)(auVar65._24_4_ + auVar47._24_4_);
                auVar109._28_4_ = (int)(in_ZMM9._28_4_ + auVar47._28_4_);
                auVar114._0_4_ = (int)(auVar83._0_4_ + auVar49._0_4_);
                auVar114._4_4_ = (int)(auVar83._4_4_ + auVar49._4_4_);
                auVar114._8_4_ = (int)(auVar83._8_4_ + auVar49._8_4_);
                auVar114._12_4_ = (int)(auVar83._12_4_ + auVar49._12_4_);
                auVar114._16_4_ = (int)(auVar83._16_4_ + auVar49._16_4_);
                auVar114._20_4_ = (int)(auVar83._20_4_ + auVar49._20_4_);
                auVar114._24_4_ = (int)(auVar83._24_4_ + auVar49._24_4_);
                auVar114._28_4_ = (int)(in_ZMM10._28_4_ + auVar49._28_4_);
                auVar47 = vpackssdw_avx2(auVar109,auVar114);
                auVar47 = vpermq_avx2(auVar47,0xd8);
                auVar47 = vpminsw_avx2(auVar47,auVar58);
                auVar47 = vpmaxsw_avx2(auVar47,auVar59);
                in_ZMM10 = ZEXT1664(auVar47._16_16_);
                auVar30 = vpacksswb_avx(auVar47._0_16_,auVar47._16_16_);
                auVar30 = vpshufb_avx(auVar30,auVar46);
                in_ZMM9 = ZEXT1664(auVar30);
                *(undefined1 (*) [16])*pauVar13 = auVar30;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
                pfVar16 = pfVar16 + iVar20 * 2;
                iVar8 = iVar8 + 2;
                uVar18 = max_kk & 0xfffffffe;
              } while (iVar8 < max_kk);
            }
            iVar8 = max_kk - uVar18;
            if (iVar8 != 0 && (int)uVar18 <= max_kk) {
              do {
                auVar67._0_4_ = fVar98 * *pfVar16;
                auVar67._4_4_ = fVar101 * pfVar16[1];
                auVar67._8_4_ = fVar102 * pfVar16[2];
                auVar67._12_4_ = fVar103 * pfVar16[3];
                auVar67._16_4_ = fVar104 * pfVar16[4];
                auVar67._20_4_ = fVar105 * pfVar16[5];
                auVar67._28_36_ = in_ZMM9._28_36_;
                auVar67._24_4_ = fVar106 * pfVar16[6];
                auVar47 = vpternlogd_avx512vl(auVar57,auVar67._0_32_,auVar48,0xf8);
                in_ZMM10 = ZEXT3264(auVar47);
                auVar110._0_4_ = (int)(auVar67._0_4_ + auVar47._0_4_);
                auVar110._4_4_ = (int)(auVar67._4_4_ + auVar47._4_4_);
                auVar110._8_4_ = (int)(auVar67._8_4_ + auVar47._8_4_);
                auVar110._12_4_ = (int)(auVar67._12_4_ + auVar47._12_4_);
                auVar110._16_4_ = (int)(auVar67._16_4_ + auVar47._16_4_);
                auVar110._20_4_ = (int)(auVar67._20_4_ + auVar47._20_4_);
                auVar110._24_4_ = (int)(auVar67._24_4_ + auVar47._24_4_);
                auVar110._28_4_ = (int)(in_ZMM9._28_4_ + auVar47._28_4_);
                auVar30 = vpmovsdb_avx512vl(auVar110);
                auVar31._8_8_ = 0;
                auVar31._0_8_ = auVar30._0_8_;
                auVar30 = vpmaxsb_avx(auVar31,auVar29);
                in_ZMM9 = ZEXT1664(auVar30);
                *(long *)*pauVar13 = auVar30._0_8_;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 8);
                pfVar16 = pfVar16 + uVar21;
                iVar8 = iVar8 + -1;
              } while (iVar8 != 0);
            }
          }
          puVar27 = puVar26 + 2;
          lVar25 = (long)puVar26 + 0xf;
          lVar22 = lVar22 + lVar23 * 0x20;
          puVar26 = puVar27;
        } while (lVar25 < max_ii);
      }
      auVar46 = _DAT_00601940;
      if ((int)((uint)puVar27 | 3) < max_ii) {
        local_70 = max_kk & 0xfffffffe;
        local_80 = (long)(iVar20 * k) * 4 +
                   ((long)puVar14 + (long)((ulong)puVar27 & 0xffffffff)) * lVar23 * 4;
        auVar60 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar61 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
        auVar30[8] = 0x81;
        auVar30._0_8_ = 0x8181818181818181;
        auVar30[9] = 0x81;
        auVar30[10] = 0x81;
        auVar30[0xb] = 0x81;
        auVar30[0xc] = 0x81;
        auVar30[0xd] = 0x81;
        auVar30[0xe] = 0x81;
        auVar30[0xf] = 0x81;
        auVar86._8_4_ = 0x80000000;
        auVar86._0_8_ = 0x8000000080000000;
        auVar86._12_4_ = 0x80000000;
        auVar86._16_4_ = 0x80000000;
        auVar86._20_4_ = 0x80000000;
        auVar86._24_4_ = 0x80000000;
        auVar86._28_4_ = 0x80000000;
        auVar88._8_4_ = 0x3f000000;
        auVar88._0_8_ = 0x3f0000003f000000;
        auVar88._12_4_ = 0x3f000000;
        auVar88._16_4_ = 0x3f000000;
        auVar88._20_4_ = 0x3f000000;
        auVar88._24_4_ = 0x3f000000;
        auVar88._28_4_ = 0x3f000000;
        auVar91._8_2_ = 0x7f;
        auVar91._0_8_ = 0x7f007f007f007f;
        auVar91._10_2_ = 0x7f;
        auVar91._12_2_ = 0x7f;
        auVar91._14_2_ = 0x7f;
        auVar91._16_2_ = 0x7f;
        auVar91._18_2_ = 0x7f;
        auVar91._20_2_ = 0x7f;
        auVar91._22_2_ = 0x7f;
        auVar91._24_2_ = 0x7f;
        auVar91._26_2_ = 0x7f;
        auVar91._28_2_ = 0x7f;
        auVar91._30_2_ = 0x7f;
        auVar95._8_2_ = 0xff81;
        auVar95._0_8_ = 0xff81ff81ff81ff81;
        auVar95._10_2_ = 0xff81;
        auVar95._12_2_ = 0xff81;
        auVar95._14_2_ = 0xff81;
        auVar95._16_2_ = 0xff81;
        auVar95._18_2_ = 0xff81;
        auVar95._20_2_ = 0xff81;
        auVar95._22_2_ = 0xff81;
        auVar95._24_2_ = 0xff81;
        auVar95._26_2_ = 0xff81;
        auVar95._28_2_ = 0xff81;
        auVar95._30_2_ = 0xff81;
        auVar32._8_4_ = 0x80000000;
        auVar32._0_8_ = 0x8000000080000000;
        auVar32._12_4_ = 0x80000000;
        auVar33._8_4_ = 0x3f000000;
        auVar33._0_8_ = 0x3f0000003f000000;
        auVar33._12_4_ = 0x3f000000;
        auVar34._8_2_ = 0x7f;
        auVar34._0_8_ = 0x7f007f007f007f;
        auVar34._10_2_ = 0x7f;
        auVar34._12_2_ = 0x7f;
        auVar34._14_2_ = 0x7f;
        auVar35._8_2_ = 0xff81;
        auVar35._0_8_ = 0xff81ff81ff81ff81;
        auVar35._10_2_ = 0xff81;
        auVar35._12_2_ = 0xff81;
        auVar35._14_2_ = 0xff81;
        puVar26 = (uint *)((ulong)puVar27 & 0xffffffff);
        do {
          lVar22 = (long)puVar26 + (long)puVar14;
          pauVar28 = (undefined1 (*) [32])
                     ((long)A->data + lVar22 * lVar23 * 4 + (long)(iVar20 * k) * 4);
          if ((iVar7 == 0x10) && (0xf < max_kk)) {
            pvVar3 = scales->data;
            auVar62 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar22 * 4)));
            in_ZMM13 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar22 * 4 + 4)));
            in_ZMM14 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar22 * 4 + 8)));
            auVar63 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar3 + lVar22 * 4 + 0xc)));
            iVar8 = 0xf;
            pauVar15 = (undefined1 (*) [64])((long)A->data + local_80);
            do {
              pauVar17 = pauVar15;
              auVar64 = vmulps_avx512f(auVar62,*pauVar17);
              auVar65 = vmulps_avx512f(in_ZMM13,pauVar17[1]);
              auVar83 = vmulps_avx512f(in_ZMM14,pauVar17[2]);
              auVar67 = vmulps_avx512f(auVar63,pauVar17[3]);
              auVar68 = vmovdqa64_avx512f(auVar61);
              auVar68 = vpternlogd_avx512f(auVar68,auVar64,auVar60,0xf8);
              auVar64 = vaddps_avx512f(auVar64,auVar68);
              auVar64 = vcvttps2dq_avx512f(auVar64);
              auVar29 = vpmovsdb_avx512f(auVar64);
              auVar29 = vpmaxsb_avx512vl(auVar29,auVar30);
              auVar64 = vmovdqa64_avx512f(auVar61);
              auVar64 = vpternlogd_avx512f(auVar64,auVar65,auVar60,0xf8);
              auVar64 = vaddps_avx512f(auVar65,auVar64);
              auVar64 = vcvttps2dq_avx512f(auVar64);
              auVar31 = vpmovsdb_avx512f(auVar64);
              auVar31 = vpmaxsb_avx512vl(auVar31,auVar30);
              auVar64 = vmovdqa64_avx512f(auVar61);
              auVar64 = vpternlogd_avx512f(auVar64,auVar83,auVar60,0xf8);
              auVar64 = vaddps_avx512f(auVar83,auVar64);
              auVar64 = vcvttps2dq_avx512f(auVar64);
              auVar36 = vpmovsdb_avx512f(auVar64);
              auVar36 = vpmaxsb_avx512vl(auVar36,auVar30);
              auVar64 = vmovdqa64_avx512f(auVar61);
              auVar64 = vpternlogd_avx512f(auVar64,auVar67,auVar60,0xf8);
              auVar64 = vaddps_avx512f(auVar67,auVar64);
              auVar64 = vcvttps2dq_avx512f(auVar64);
              auVar38 = vpmovsdb_avx512f(auVar64);
              auVar38 = vpmaxsb_avx512vl(auVar38,auVar30);
              auVar39 = vpunpcklwd_avx512vl(auVar29,auVar31);
              auVar29 = vpunpckhwd_avx512vl(auVar29,auVar31);
              auVar31 = vpunpcklwd_avx512vl(auVar36,auVar38);
              auVar36 = vpunpckhwd_avx512vl(auVar36,auVar38);
              auVar38 = vpunpckldq_avx512vl(auVar39,auVar31);
              auVar31 = vpunpckhdq_avx512vl(auVar39,auVar31);
              auVar39 = vpunpckldq_avx512vl(auVar29,auVar36);
              auVar36 = vpunpckhdq_avx512vl(auVar29,auVar36);
              auVar29 = vmovdqa64_avx512vl(auVar38);
              *(undefined1 (*) [16])*pauVar13 = auVar29;
              auVar29 = vmovdqa64_avx512vl(auVar31);
              *(undefined1 (*) [16])(*pauVar13 + 0x10) = auVar29;
              auVar29 = vmovdqa64_avx512vl(auVar39);
              *(undefined1 (*) [16])(*pauVar13 + 0x20) = auVar29;
              auVar29 = vmovdqa64_avx512vl(auVar36);
              *(undefined1 (*) [16])(*pauVar13 + 0x30) = auVar29;
              pauVar13 = pauVar13 + 1;
              iVar8 = iVar8 + 0x10;
              pauVar15 = (undefined1 (*) [64])(*pauVar17 + (long)(iVar20 << 4) * 4);
            } while (iVar8 < max_kk);
            pauVar28 = (undefined1 (*) [32])(*pauVar17 + (long)(iVar20 << 4) * 4);
          }
          if ((iVar7 == 8) && (7 < max_kk)) {
            pvVar3 = scales->data;
            uVar2 = *(undefined4 *)((long)pvVar3 + lVar22 * 4);
            auVar122._4_4_ = uVar2;
            auVar122._0_4_ = uVar2;
            auVar122._8_4_ = uVar2;
            auVar122._12_4_ = uVar2;
            auVar122._16_4_ = uVar2;
            auVar122._20_4_ = uVar2;
            auVar122._24_4_ = uVar2;
            auVar122._28_4_ = uVar2;
            uVar2 = *(undefined4 *)((long)pvVar3 + lVar22 * 4 + 4);
            auVar131._4_4_ = uVar2;
            auVar131._0_4_ = uVar2;
            auVar131._8_4_ = uVar2;
            auVar131._12_4_ = uVar2;
            auVar131._16_4_ = uVar2;
            auVar131._20_4_ = uVar2;
            auVar131._24_4_ = uVar2;
            auVar131._28_4_ = uVar2;
            in_ZMM13 = ZEXT3264(auVar131);
            uVar2 = *(undefined4 *)((long)pvVar3 + lVar22 * 4 + 8);
            auVar137._4_4_ = uVar2;
            auVar137._0_4_ = uVar2;
            auVar137._8_4_ = uVar2;
            auVar137._12_4_ = uVar2;
            auVar137._16_4_ = uVar2;
            auVar137._20_4_ = uVar2;
            auVar137._24_4_ = uVar2;
            auVar137._28_4_ = uVar2;
            in_ZMM14 = ZEXT3264(auVar137);
            uVar2 = *(undefined4 *)((long)pvVar3 + lVar22 * 4 + 0xc);
            auVar142._4_4_ = uVar2;
            auVar142._0_4_ = uVar2;
            auVar142._8_4_ = uVar2;
            auVar142._12_4_ = uVar2;
            auVar142._16_4_ = uVar2;
            auVar142._20_4_ = uVar2;
            auVar142._24_4_ = uVar2;
            auVar142._28_4_ = uVar2;
            iVar8 = 7;
            do {
              auVar47 = vmulps_avx512vl(auVar122,*pauVar28);
              auVar48 = vmulps_avx512vl(auVar131,pauVar28[1]);
              auVar49 = vmulps_avx512vl(auVar137,pauVar28[2]);
              auVar57 = vmulps_avx512vl(auVar142,pauVar28[3]);
              auVar58 = vmovdqa64_avx512vl(auVar88);
              auVar58 = vpternlogd_avx512vl(auVar58,auVar47,auVar86,0xf8);
              auVar59 = vmovdqa64_avx512vl(auVar88);
              auVar59 = vpternlogd_avx512vl(auVar59,auVar49,auVar86,0xf8);
              auVar47 = vaddps_avx512vl(auVar47,auVar58);
              auVar49 = vaddps_avx512vl(auVar49,auVar59);
              auVar47 = vcvttps2dq_avx512vl(auVar47);
              auVar49 = vcvttps2dq_avx512vl(auVar49);
              auVar47 = vpackssdw_avx512vl(auVar47,auVar49);
              auVar47 = vpermq_avx512vl(auVar47,0xd8);
              auVar47 = vpminsw_avx512vl(auVar47,auVar91);
              auVar47 = vpmaxsw_avx512vl(auVar47,auVar95);
              auVar29 = vextracti32x4_avx512vl(auVar47,1);
              auVar29 = vpacksswb_avx512vl(auVar47._0_16_,auVar29);
              auVar47 = vmovdqa64_avx512vl(auVar88);
              auVar47 = vpternlogd_avx512vl(auVar47,auVar48,auVar86,0xf8);
              auVar49 = vmovdqa64_avx512vl(auVar88);
              auVar49 = vpternlogd_avx512vl(auVar49,auVar57,auVar86,0xf8);
              auVar47 = vaddps_avx512vl(auVar48,auVar47);
              auVar48 = vaddps_avx512vl(auVar57,auVar49);
              auVar47 = vcvttps2dq_avx512vl(auVar47);
              auVar48 = vcvttps2dq_avx512vl(auVar48);
              auVar47 = vpackssdw_avx512vl(auVar47,auVar48);
              auVar47 = vpermq_avx512vl(auVar47,0xd8);
              auVar47 = vpminsw_avx512vl(auVar47,auVar91);
              auVar47 = vpmaxsw_avx512vl(auVar47,auVar95);
              auVar31 = vextracti32x4_avx512vl(auVar47,1);
              auVar31 = vpacksswb_avx512vl(auVar47._0_16_,auVar31);
              auVar36 = vpunpcklwd_avx512vl(auVar29,auVar31);
              auVar29 = vpunpckhwd_avx512vl(auVar29,auVar31);
              auVar31 = vpunpckldq_avx512vl(auVar36,auVar29);
              auVar36 = vpunpckhdq_avx512vl(auVar36,auVar29);
              auVar29 = vmovdqa64_avx512vl(auVar31);
              *(undefined1 (*) [16])*pauVar13 = auVar29;
              auVar29 = vmovdqa64_avx512vl(auVar36);
              *(undefined1 (*) [16])(*pauVar13 + 0x10) = auVar29;
              pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
              pauVar28 = (undefined1 (*) [32])(*pauVar28 + (long)(iVar20 * 8) * 4);
              iVar8 = iVar8 + 8;
            } while (iVar8 < max_kk);
          }
          if ((iVar7 == 4) && (3 < max_kk)) {
            pvVar3 = scales->data;
            uVar2 = *(undefined4 *)((long)pvVar3 + lVar22 * 4);
            auVar36._4_4_ = uVar2;
            auVar36._0_4_ = uVar2;
            auVar36._8_4_ = uVar2;
            auVar36._12_4_ = uVar2;
            uVar2 = *(undefined4 *)((long)pvVar3 + lVar22 * 4 + 4);
            auVar38._4_4_ = uVar2;
            auVar38._0_4_ = uVar2;
            auVar38._8_4_ = uVar2;
            auVar38._12_4_ = uVar2;
            in_ZMM13 = ZEXT1664(auVar38);
            uVar2 = *(undefined4 *)((long)pvVar3 + lVar22 * 4 + 8);
            auVar39._4_4_ = uVar2;
            auVar39._0_4_ = uVar2;
            auVar39._8_4_ = uVar2;
            auVar39._12_4_ = uVar2;
            in_ZMM14 = ZEXT1664(auVar39);
            uVar2 = *(undefined4 *)((long)pvVar3 + lVar22 * 4 + 0xc);
            auVar37._4_4_ = uVar2;
            auVar37._0_4_ = uVar2;
            auVar37._8_4_ = uVar2;
            auVar37._12_4_ = uVar2;
            iVar8 = 3;
            do {
              auVar29 = vmulps_avx512vl(auVar36,*(undefined1 (*) [16])*pauVar28);
              auVar31 = vmulps_avx512vl(auVar38,*(undefined1 (*) [16])(*pauVar28 + 0x10));
              auVar40 = vmulps_avx512vl(auVar39,*(undefined1 (*) [16])pauVar28[1]);
              auVar41 = vmulps_avx512vl(auVar37,*(undefined1 (*) [16])(pauVar28[1] + 0x10));
              auVar42 = vmovdqa64_avx512vl(auVar33);
              auVar42 = vpternlogd_avx512vl(auVar42,auVar29,auVar32,0xf8);
              auVar43 = vmovdqa64_avx512vl(auVar33);
              auVar43 = vpternlogd_avx512vl(auVar43,auVar31,auVar32,0xf8);
              auVar44 = vmovdqa64_avx512vl(auVar33);
              auVar44 = vpternlogd_avx512vl(auVar44,auVar40,auVar32,0xf8);
              auVar45 = vmovdqa64_avx512vl(auVar33);
              auVar45 = vpternlogd_avx512vl(auVar45,auVar41,auVar32,0xf8);
              auVar29 = vaddps_avx512vl(auVar29,auVar42);
              auVar31 = vaddps_avx512vl(auVar31,auVar43);
              auVar40 = vaddps_avx512vl(auVar40,auVar44);
              auVar41 = vaddps_avx512vl(auVar41,auVar45);
              auVar29 = vcvttps2dq_avx512vl(auVar29);
              auVar31 = vcvttps2dq_avx512vl(auVar31);
              auVar29 = vpackssdw_avx512vl(auVar29,auVar31);
              auVar31 = vcvttps2dq_avx512vl(auVar40);
              auVar40 = vcvttps2dq_avx512vl(auVar41);
              auVar31 = vpackssdw_avx512vl(auVar31,auVar40);
              auVar29 = vpminsw_avx512vl(auVar29,auVar34);
              auVar31 = vpminsw_avx512vl(auVar31,auVar34);
              auVar29 = vpmaxsw_avx512vl(auVar29,auVar35);
              auVar31 = vpmaxsw_avx512vl(auVar31,auVar35);
              auVar29 = vpacksswb_avx512vl(auVar29,auVar31);
              auVar29 = vpshufb_avx512vl(auVar29,auVar46);
              auVar29 = vmovdqa64_avx512vl(auVar29);
              *(undefined1 (*) [16])*pauVar13 = auVar29;
              pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
              pauVar28 = (undefined1 (*) [32])(*pauVar28 + (long)(iVar20 * 4) * 4);
              iVar8 = iVar8 + 4;
            } while (iVar8 < max_kk);
          }
          if (iVar7 == 1) {
            auVar29 = *(undefined1 (*) [16])
                       ((long)scales->data + (long)puVar26 * 4 + (long)puVar14 * 4);
            fVar101 = auVar29._4_4_;
            fVar102 = auVar29._8_4_;
            fVar103 = auVar29._12_4_;
            fVar98 = auVar29._0_4_;
            uVar18 = 0;
            if (1 < max_kk) {
              iVar8 = 1;
              do {
                auVar40._0_4_ = fVar98 * *(float *)*pauVar28;
                auVar40._4_4_ = fVar101 * *(float *)(*pauVar28 + 4);
                auVar40._8_4_ = fVar102 * *(float *)(*pauVar28 + 8);
                auVar40._12_4_ = fVar103 * *(float *)(*pauVar28 + 0xc);
                pfVar16 = (float *)(*pauVar28 + uVar21 * 4);
                auVar42._0_4_ = fVar98 * *pfVar16;
                auVar42._4_4_ = fVar101 * pfVar16[1];
                auVar42._8_4_ = fVar102 * pfVar16[2];
                auVar42._12_4_ = fVar103 * pfVar16[3];
                auVar31 = vunpcklps_avx(auVar40,auVar42);
                auVar29 = vunpckhps_avx(auVar40,auVar42);
                auVar36 = vpternlogd_avx512vl(auVar33,auVar31,auVar32,0xf8);
                auVar38 = vmovdqa64_avx512vl(auVar33);
                auVar38 = vpternlogd_avx512vl(auVar38,auVar29,auVar32,0xf8);
                auVar29 = vaddps_avx512vl(auVar29,auVar38);
                auVar43._0_4_ = (int)(auVar31._0_4_ + auVar36._0_4_);
                auVar43._4_4_ = (int)(auVar31._4_4_ + auVar36._4_4_);
                auVar43._8_4_ = (int)(auVar31._8_4_ + auVar36._8_4_);
                auVar43._12_4_ = (int)(auVar31._12_4_ + auVar36._12_4_);
                in_ZMM14 = ZEXT1664(auVar43);
                auVar41._0_4_ = (int)auVar29._0_4_;
                auVar41._4_4_ = (int)auVar29._4_4_;
                auVar41._8_4_ = (int)auVar29._8_4_;
                auVar41._12_4_ = (int)auVar29._12_4_;
                auVar29 = vpackssdw_avx(auVar43,auVar41);
                auVar29 = vpminsw_avx(auVar29,auVar34);
                auVar29 = vpmaxsw_avx(auVar29,auVar35);
                auVar29 = vpacksswb_avx(auVar29,auVar29);
                in_ZMM13 = ZEXT1664(auVar29);
                *(long *)*pauVar13 = auVar29._0_8_;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 8);
                pauVar28 = (undefined1 (*) [32])(*pauVar28 + (long)(iVar20 * 2) * 4);
                iVar8 = iVar8 + 2;
                uVar18 = local_70;
              } while (iVar8 < max_kk);
            }
            iVar8 = max_kk - uVar18;
            if (iVar8 != 0 && (int)uVar18 <= max_kk) {
              do {
                auVar44._0_4_ = fVar98 * *(float *)*pauVar28;
                auVar44._4_4_ = fVar101 * *(float *)(*pauVar28 + 4);
                auVar44._8_4_ = fVar102 * *(float *)(*pauVar28 + 8);
                auVar44._12_4_ = fVar103 * *(float *)(*pauVar28 + 0xc);
                auVar29 = vpternlogd_avx512vl(auVar33,auVar44,auVar32,0xf8);
                in_ZMM14 = ZEXT1664(auVar29);
                auVar45._0_4_ = (int)(auVar44._0_4_ + auVar29._0_4_);
                auVar45._4_4_ = (int)(auVar44._4_4_ + auVar29._4_4_);
                auVar45._8_4_ = (int)(auVar44._8_4_ + auVar29._8_4_);
                auVar45._12_4_ = (int)(auVar44._12_4_ + auVar29._12_4_);
                auVar29 = vpackssdw_avx(auVar45,auVar45);
                auVar29 = vpminsw_avx(auVar29,auVar34);
                auVar29 = vpmaxsw_avx(auVar29,auVar35);
                auVar29 = vpacksswb_avx(auVar29,auVar29);
                in_ZMM13 = ZEXT1664(auVar29);
                *(int *)*pauVar13 = auVar29._0_4_;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
                pauVar28 = (undefined1 (*) [32])(*pauVar28 + uVar21 * 4);
                iVar8 = iVar8 + -1;
              } while (iVar8 != 0);
            }
          }
          puVar27 = puVar26 + 1;
          lVar22 = (long)puVar26 + 7;
          local_80 = local_80 + lVar23 * 0x10;
          puVar26 = puVar27;
        } while (lVar22 < max_ii);
      }
      auVar46 = _DAT_005f39f0;
      puVar6 = &stack0xffffffffffffff58;
      uVar24 = uVar21;
      if ((int)((uint)puVar27 | 1) < max_ii) {
        puVar27 = (uint *)(long)(int)(uint)puVar27;
        lVar23 = (long)(iVar20 * 4) * 4;
        auVar60 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar61 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
        auVar84[8] = 0x81;
        auVar84._0_8_ = 0x8181818181818181;
        auVar84[9] = 0x81;
        auVar84[10] = 0x81;
        auVar84[0xb] = 0x81;
        auVar84[0xc] = 0x81;
        auVar84[0xd] = 0x81;
        auVar84[0xe] = 0x81;
        auVar84[0xf] = 0x81;
        auVar87._8_4_ = 0x80000000;
        auVar87._0_8_ = 0x8000000080000000;
        auVar87._12_4_ = 0x80000000;
        auVar87._16_4_ = 0x80000000;
        auVar87._20_4_ = 0x80000000;
        auVar87._24_4_ = 0x80000000;
        auVar87._28_4_ = 0x80000000;
        auVar89._8_4_ = 0x3f000000;
        auVar89._0_8_ = 0x3f0000003f000000;
        auVar89._12_4_ = 0x3f000000;
        auVar89._16_4_ = 0x3f000000;
        auVar89._20_4_ = 0x3f000000;
        auVar89._24_4_ = 0x3f000000;
        auVar89._28_4_ = 0x3f000000;
        auVar92._8_2_ = 0x7f;
        auVar92._0_8_ = 0x7f007f007f007f;
        auVar92._10_2_ = 0x7f;
        auVar92._12_2_ = 0x7f;
        auVar92._14_2_ = 0x7f;
        auVar92._16_2_ = 0x7f;
        auVar92._18_2_ = 0x7f;
        auVar92._20_2_ = 0x7f;
        auVar92._22_2_ = 0x7f;
        auVar92._24_2_ = 0x7f;
        auVar92._26_2_ = 0x7f;
        auVar92._28_2_ = 0x7f;
        auVar92._30_2_ = 0x7f;
        auVar96._8_2_ = 0xff81;
        auVar96._0_8_ = 0xff81ff81ff81ff81;
        auVar96._10_2_ = 0xff81;
        auVar96._12_2_ = 0xff81;
        auVar96._14_2_ = 0xff81;
        auVar96._16_2_ = 0xff81;
        auVar96._18_2_ = 0xff81;
        auVar96._20_2_ = 0xff81;
        auVar96._22_2_ = 0xff81;
        auVar96._24_2_ = 0xff81;
        auVar96._26_2_ = 0xff81;
        auVar96._28_2_ = 0xff81;
        auVar96._30_2_ = 0xff81;
        auVar99._8_4_ = 0x80000000;
        auVar99._0_8_ = 0x8000000080000000;
        auVar99._12_4_ = 0x80000000;
        auVar107._8_4_ = 0x3f000000;
        auVar107._0_8_ = 0x3f0000003f000000;
        auVar107._12_4_ = 0x3f000000;
        auVar111._8_2_ = 0x7f;
        auVar111._0_8_ = 0x7f007f007f007f;
        auVar111._10_2_ = 0x7f;
        auVar111._12_2_ = 0x7f;
        auVar111._14_2_ = 0x7f;
        auVar115._8_2_ = 0xff81;
        auVar115._0_8_ = 0xff81ff81ff81ff81;
        auVar115._10_2_ = 0xff81;
        auVar115._12_2_ = 0xff81;
        auVar115._14_2_ = 0xff81;
        auVar119._8_4_ = 0x80000000;
        auVar119._0_8_ = 0x8000000080000000;
        auVar119._12_4_ = 0x80000000;
        auVar123._8_4_ = 0x3effffff;
        auVar123._0_8_ = 0x3effffff3effffff;
        auVar123._12_4_ = 0x3effffff;
        in_ZMM13 = ZEXT1664(auVar123);
        do {
          *(uint **)(puVar19 + 0x28) = puVar27;
          lVar22 = *(long *)(puVar19 + 0x18) + (long)puVar27;
          pauVar28 = (undefined1 (*) [32])
                     (**(long **)(puVar19 + 0x50) + *(long *)(puVar19 + 0x48) * 4 +
                     lVar22 * *(long *)(puVar19 + 8) * 4);
          if (((int)*(long *)(puVar19 + 8) == 0x10) && (0xf < max_kk)) {
            in_ZMM14 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)scales->data + lVar22 * 4)));
            auVar62 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)scales->data + lVar22 * 4 + 4)));
            iVar7 = 0xf;
            pauVar15 = (undefined1 (*) [64])
                       (**(long **)(puVar19 + 0x50) + *(long *)(puVar19 + 0x30));
            do {
              pauVar17 = pauVar15;
              auVar63 = vmulps_avx512f(in_ZMM14,*pauVar17);
              auVar64 = vmulps_avx512f(auVar62,pauVar17[1]);
              auVar65 = vmovdqa64_avx512f(auVar61);
              auVar65 = vpternlogd_avx512f(auVar65,auVar63,auVar60,0xf8);
              auVar63 = vaddps_avx512f(auVar63,auVar65);
              auVar63 = vcvttps2dq_avx512f(auVar63);
              auVar29 = vpmovsdb_avx512f(auVar63);
              auVar29 = vpmaxsb_avx512vl(auVar29,auVar84);
              auVar63 = vmovdqa64_avx512f(auVar61);
              auVar63 = vpternlogd_avx512f(auVar63,auVar64,auVar60,0xf8);
              auVar63 = vaddps_avx512f(auVar64,auVar63);
              auVar63 = vcvttps2dq_avx512f(auVar63);
              auVar30 = vpmovsdb_avx512f(auVar63);
              auVar30 = vpmaxsb_avx512vl(auVar30,auVar84);
              auVar31 = vpunpcklwd_avx512vl(auVar29,auVar30);
              auVar30 = vpunpckhwd_avx512vl(auVar29,auVar30);
              auVar29 = vmovdqa64_avx512vl(auVar31);
              *(undefined1 (*) [16])*pauVar13 = auVar29;
              auVar29 = vmovdqa64_avx512vl(auVar30);
              *(undefined1 (*) [16])(*pauVar13 + 0x10) = auVar29;
              pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
              iVar7 = iVar7 + 0x10;
              pauVar15 = (undefined1 (*) [64])(*pauVar17 + (long)(iVar20 << 4) * 4);
            } while (iVar7 < max_kk);
            pauVar28 = (undefined1 (*) [32])(*pauVar17 + *(long *)(puVar19 + 0x38) * 4);
          }
          if ((*(int *)(puVar19 + 8) == 8) && (7 < max_kk)) {
            uVar2 = *(undefined4 *)((long)scales->data + lVar22 * 4);
            auVar138._4_4_ = uVar2;
            auVar138._0_4_ = uVar2;
            auVar138._8_4_ = uVar2;
            auVar138._12_4_ = uVar2;
            auVar138._16_4_ = uVar2;
            auVar138._20_4_ = uVar2;
            auVar138._24_4_ = uVar2;
            auVar138._28_4_ = uVar2;
            in_ZMM14 = ZEXT3264(auVar138);
            uVar2 = *(undefined4 *)((long)scales->data + lVar22 * 4 + 4);
            auVar143._4_4_ = uVar2;
            auVar143._0_4_ = uVar2;
            auVar143._8_4_ = uVar2;
            auVar143._12_4_ = uVar2;
            auVar143._16_4_ = uVar2;
            auVar143._20_4_ = uVar2;
            auVar143._24_4_ = uVar2;
            auVar143._28_4_ = uVar2;
            iVar7 = 7;
            do {
              auVar47 = vmulps_avx512vl(auVar138,*pauVar28);
              auVar48 = vmulps_avx512vl(auVar143,pauVar28[1]);
              auVar49 = vmovdqa64_avx512vl(auVar89);
              auVar49 = vpternlogd_avx512vl(auVar49,auVar47,auVar87,0xf8);
              auVar57 = vmovdqa64_avx512vl(auVar89);
              auVar57 = vpternlogd_avx512vl(auVar57,auVar48,auVar87,0xf8);
              auVar47 = vaddps_avx512vl(auVar47,auVar49);
              auVar48 = vaddps_avx512vl(auVar48,auVar57);
              auVar47 = vcvttps2dq_avx512vl(auVar47);
              auVar48 = vcvttps2dq_avx512vl(auVar48);
              auVar47 = vpackssdw_avx512vl(auVar47,auVar48);
              auVar47 = vpermq_avx512vl(auVar47,0xd8);
              auVar47 = vpminsw_avx512vl(auVar47,auVar92);
              auVar47 = vpmaxsw_avx512vl(auVar47,auVar96);
              auVar29 = vextracti32x4_avx512vl(auVar47,1);
              auVar29 = vpacksswb_avx512vl(auVar47._0_16_,auVar29);
              auVar29 = vpshufb_avx512vl(auVar29,auVar46);
              auVar29 = vmovdqa64_avx512vl(auVar29);
              *(undefined1 (*) [16])*pauVar13 = auVar29;
              pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
              pauVar28 = (undefined1 (*) [32])(*pauVar28 + (long)(iVar20 * 8) * 4);
              iVar7 = iVar7 + 8;
            } while (iVar7 < max_kk);
          }
          if ((*(int *)(puVar19 + 8) == 4) && (3 < max_kk)) {
            uVar2 = *(undefined4 *)((long)scales->data + lVar22 * 4);
            auVar133._4_4_ = uVar2;
            auVar133._0_4_ = uVar2;
            auVar133._8_4_ = uVar2;
            auVar133._12_4_ = uVar2;
            in_ZMM14 = ZEXT1664(auVar133);
            uVar2 = *(undefined4 *)((long)scales->data + lVar22 * 4 + 4);
            auVar139._4_4_ = uVar2;
            auVar139._0_4_ = uVar2;
            auVar139._8_4_ = uVar2;
            auVar139._12_4_ = uVar2;
            iVar7 = 3;
            do {
              auVar30 = vmulps_avx512vl(auVar133,*(undefined1 (*) [16])*pauVar28);
              auVar31 = vmulps_avx512vl(auVar139,*(undefined1 (*) [16])(*pauVar28 + 0x10));
              auVar29 = vmovlhps_avx512f(auVar30,auVar31);
              auVar30 = vunpckhpd_avx512vl(auVar30,auVar31);
              auVar31 = vmovdqa64_avx512vl(auVar107);
              auVar31 = vpternlogd_avx512vl(auVar31,auVar29,auVar99,0xf8);
              auVar32 = vmovdqa64_avx512vl(auVar107);
              auVar32 = vpternlogd_avx512vl(auVar32,auVar30,auVar99,0xf8);
              auVar29 = vaddps_avx512vl(auVar29,auVar31);
              auVar30 = vaddps_avx512vl(auVar30,auVar32);
              auVar29 = vcvttps2dq_avx512vl(auVar29);
              auVar30 = vcvttps2dq_avx512vl(auVar30);
              auVar29 = vpackssdw_avx512vl(auVar29,auVar30);
              auVar29 = vpminsw_avx512vl(auVar29,auVar111);
              auVar29 = vpmaxsw_avx512vl(auVar29,auVar115);
              auVar29 = vpacksswb_avx512vl(auVar29,auVar29);
              *(long *)*pauVar13 = auVar29._0_8_;
              pauVar13 = (undefined1 (*) [64])(*pauVar13 + 8);
              pauVar28 = (undefined1 (*) [32])(*pauVar28 + lVar23);
              iVar7 = iVar7 + 4;
            } while (iVar7 < max_kk);
          }
          if (*(int *)(puVar19 + 8) == 1) {
            uVar2 = *(undefined4 *)((long)scales->data + lVar22 * 4);
            auVar134._4_4_ = uVar2;
            auVar134._0_4_ = uVar2;
            auVar134._8_4_ = uVar2;
            auVar134._12_4_ = uVar2;
            in_ZMM14 = ZEXT1664(auVar134);
            uVar18 = 0;
            uVar2 = *(undefined4 *)((long)scales->data + lVar22 * 4 + 4);
            auVar140._4_4_ = uVar2;
            auVar140._0_4_ = uVar2;
            auVar140._8_4_ = uVar2;
            auVar140._12_4_ = uVar2;
            if (3 < max_kk) {
              iVar7 = 3;
              lVar22 = *(long *)(puVar19 + 0x68);
              do {
                auVar144._8_8_ = 0;
                auVar144._0_8_ = *(ulong *)*pauVar28;
                auVar145._8_8_ = 0;
                auVar145._0_8_ = *(ulong *)(*pauVar28 + uVar24 * 4);
                auVar30 = vunpcklps_avx512vl(auVar144,auVar145);
                auVar146._8_8_ = 0;
                auVar146._0_8_ = *(ulong *)(*pauVar28 + lVar22 * 4);
                auVar148._8_8_ = 0;
                auVar148._0_8_ = *(ulong *)(*pauVar28 + (long)(iVar20 * 3) * 4);
                auVar31 = vunpcklps_avx512vl(auVar146,auVar148);
                auVar29 = vmovlhps_avx512f(auVar30,auVar31);
                auVar30 = vunpckhpd_avx512vl(auVar30,auVar31);
                auVar31 = vmulps_avx512vl(auVar134,auVar29);
                auVar30 = vmulps_avx512vl(auVar140,auVar30);
                auVar29 = vmovlhps_avx512f(auVar31,auVar30);
                auVar30 = vunpckhpd_avx512vl(auVar31,auVar30);
                auVar31 = vmovdqa64_avx512vl(auVar107);
                auVar31 = vpternlogd_avx512vl(auVar31,auVar29,auVar99,0xf8);
                auVar32 = vmovdqa64_avx512vl(auVar107);
                auVar32 = vpternlogd_avx512vl(auVar32,auVar30,auVar99,0xf8);
                auVar29 = vaddps_avx512vl(auVar29,auVar31);
                auVar30 = vaddps_avx512vl(auVar30,auVar32);
                auVar29 = vcvttps2dq_avx512vl(auVar29);
                auVar30 = vcvttps2dq_avx512vl(auVar30);
                auVar29 = vpackssdw_avx512vl(auVar29,auVar30);
                auVar29 = vpminsw_avx512vl(auVar29,auVar111);
                auVar29 = vpmaxsw_avx512vl(auVar29,auVar115);
                auVar29 = vpacksswb_avx512vl(auVar29,auVar29);
                *(long *)*pauVar13 = auVar29._0_8_;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 8);
                pauVar28 = (undefined1 (*) [32])(*pauVar28 + lVar23);
                iVar7 = iVar7 + 4;
              } while (iVar7 < max_kk);
              uVar18 = *(uint *)(puVar19 + 0x5c);
            }
            if ((int)(uVar18 | 1) < max_kk) {
              auVar29 = vmovlhps_avx512f(auVar134,auVar140);
              uVar9 = uVar18;
              do {
                auVar147._8_8_ = 0;
                auVar147._0_8_ = *(ulong *)*pauVar28;
                auVar149._8_8_ = 0;
                auVar149._0_8_ = *(ulong *)(*pauVar28 + uVar24 * 4);
                auVar30 = vunpcklps_avx512vl(auVar147,auVar149);
                auVar30 = vmulps_avx512vl(auVar30,auVar29);
                auVar31 = vmovdqa64_avx512vl(auVar107);
                auVar31 = vpternlogd_avx512vl(auVar31,auVar30,auVar99,0xf8);
                auVar30 = vaddps_avx512vl(auVar30,auVar31);
                auVar30 = vcvttps2dq_avx512vl(auVar30);
                auVar30 = vpackssdw_avx512vl(auVar30,auVar30);
                auVar30 = vpminsw_avx512vl(auVar30,auVar111);
                auVar30 = vpmaxsw_avx512vl(auVar30,auVar115);
                auVar30 = vpacksswb_avx512vl(auVar30,auVar30);
                *(int *)*pauVar13 = auVar30._0_4_;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
                uVar18 = uVar9 + 2;
                pauVar28 = (undefined1 (*) [32])(*pauVar28 + (long)(iVar20 * 2) * 4);
                iVar7 = uVar9 + 3;
                uVar9 = uVar18;
              } while (iVar7 < max_kk);
            }
            puVar14 = (uint *)(ulong)uVar18;
            uVar9 = max_kk - uVar18;
            if (uVar9 != 0 && (int)uVar18 <= max_kk) {
              puVar27 = (uint *)(*pauVar28 + 4);
              do {
                pcVar12 = (char *)(ulong)uVar9;
                auVar29 = vmulss_avx512f(auVar134,ZEXT416(puVar27[-1]));
                auVar30 = vmovdqa64_avx512vl(auVar123);
                auVar30 = vpternlogd_avx512vl(auVar30,auVar29,auVar119,0xf8);
                auVar29 = vaddss_avx512f(auVar29,auVar30);
                vrndscaless_avx512f(auVar29,auVar29);
                uVar18 = (uint)puVar19 | *(uint *)((long)puVar14 + -0x4f);
                if ((int)uVar18 < 1) {
                  *pcVar12 = *pcVar12 + (char)uVar9;
                }
                else {
                  pcVar12 = (char *)(ulong)CONCAT31((int3)(uVar9 >> 8),(char)uVar9 + '0');
                  if ((int)puVar14 < -0x7e) {
                    puVar14 = (uint *)0xffffff81;
                  }
                }
                if (0x7e < (int)puVar14) {
                  puVar14 = (uint *)0x7f;
                }
                (*pauVar13)[0] = (char)puVar14;
                auVar29 = vmulss_avx512f(auVar140,ZEXT416(*puVar27));
                auVar30 = vmovdqa64_avx512vl(auVar123);
                auVar30 = vpternlogd_avx512vl(auVar30,auVar29,auVar119,0xf8);
                auVar29 = vaddss_avx512f(auVar29,auVar30);
                vrndscaless_avx512f(auVar29,auVar29);
                uVar18 = uVar18 | *(uint *)((long)puVar14 + -0x4f);
                puVar19 = (undefined1 *)(ulong)uVar18;
                if ((int)uVar18 < 1) {
                  if (-0x57c0001 < iVar20 * 4) goto code_r0x004f1757;
                  uVar9 = (int)pcVar12 + 0x7fba;
                  *(char *)((ulong)uVar9 - 0x7cb7feaf) =
                       *(char *)((ulong)uVar9 - 0x7cb7feaf) + (char)pauVar13;
                  *puVar14 = *puVar14 << 9 | *puVar14 >> 0x17;
                  uVar24 = (ulong)(uint)((int)uVar24 + iVar20 * 4);
                }
                else {
                  uVar9 = (uint)CONCAT71((int7)((ulong)pcVar12 >> 8),(char)pcVar12 + '0');
                  if ((int)puVar14 < -0x7e) {
                    puVar14 = (uint *)0xffffff81;
                  }
                  if (0x7e < (int)puVar14) {
                    puVar14 = (uint *)0x7f;
                  }
                }
                (*pauVar13)[1] = (char)puVar14;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 2);
                puVar27 = puVar27 + uVar21;
                uVar9 = uVar9 - 1;
              } while (uVar9 != 0);
            }
          }
          puVar27 = (uint *)(*(long *)(puVar19 + 0x28) + 2);
          *(long *)(puVar19 + 0x30) = *(long *)(puVar19 + 0x30) + *(long *)(puVar19 + 0x40);
        } while (*(long *)(puVar19 + 0x28) + 3 < *(long *)(puVar19 + 0x60));
        puVar14 = *(uint **)(puVar19 + 0x18);
        max_ii = *(int *)(puVar19 + 0x24);
        puVar6 = puVar19;
      }
      puVar19 = puVar6;
      if ((int)puVar27 < max_ii) {
code_r0x004f1757:
        iVar7 = *(int *)(puVar19 + 0x14);
        iVar20 = (int)uVar24;
        auVar46 = vpbroadcastd_avx512vl();
        vpmulld_avx(auVar46,_DAT_005f34d0);
        *(uint *)(puVar19 + 0x14) = max_kk & 0xfffffffc;
        lVar22 = (long)(int)puVar27;
        lVar23 = (long)(iVar7 * iVar20) * 4 + (lVar22 + (long)puVar14) * *(long *)(puVar19 + 8) * 4;
        *(long *)(puVar19 + 0x28) = *(long *)(puVar19 + 8) * 4;
        *(long *)(puVar19 + 0x30) = (long)(iVar20 << 4);
        auVar60 = vpbroadcastd_avx512f(ZEXT416(0x3f000000));
        auVar61 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar85[8] = 0x81;
        auVar85._0_8_ = 0x8181818181818181;
        auVar85[9] = 0x81;
        auVar85[10] = 0x81;
        auVar85[0xb] = 0x81;
        auVar85[0xc] = 0x81;
        auVar85[0xd] = 0x81;
        auVar85[0xe] = 0x81;
        auVar85[0xf] = 0x81;
        auVar90._8_4_ = 0x3f000000;
        auVar90._0_8_ = 0x3f0000003f000000;
        auVar90._12_4_ = 0x3f000000;
        auVar90._16_4_ = 0x3f000000;
        auVar90._20_4_ = 0x3f000000;
        auVar90._24_4_ = 0x3f000000;
        auVar90._28_4_ = 0x3f000000;
        auVar93._8_4_ = 0x80000000;
        auVar93._0_8_ = 0x8000000080000000;
        auVar93._12_4_ = 0x80000000;
        auVar93._16_4_ = 0x80000000;
        auVar93._20_4_ = 0x80000000;
        auVar93._24_4_ = 0x80000000;
        auVar93._28_4_ = 0x80000000;
        auVar94._8_4_ = 0x3f000000;
        auVar94._0_8_ = 0x3f0000003f000000;
        auVar94._12_4_ = 0x3f000000;
        auVar97._8_4_ = 0x80000000;
        auVar97._0_8_ = 0x8000000080000000;
        auVar97._12_4_ = 0x80000000;
        auVar100._8_2_ = 0x7f;
        auVar100._0_8_ = 0x7f007f007f007f;
        auVar100._10_2_ = 0x7f;
        auVar100._12_2_ = 0x7f;
        auVar100._14_2_ = 0x7f;
        auVar108._8_2_ = 0xff81;
        auVar108._0_8_ = 0xff81ff81ff81ff81;
        auVar108._10_2_ = 0xff81;
        auVar108._12_2_ = 0xff81;
        auVar108._14_2_ = 0xff81;
        auVar112._8_4_ = 0x3effffff;
        auVar112._0_8_ = 0x3effffff3effffff;
        auVar112._12_4_ = 0x3effffff;
        do {
          lVar25 = lVar22 + (long)puVar14;
          pfVar16 = (float *)(**(long **)(puVar19 + 0x50) + (long)(iVar7 * iVar20) * 4 +
                             lVar25 * *(long *)(puVar19 + 8) * 4);
          fVar98 = *(float *)((long)scales->data + lVar25 * 4);
          if (((int)*(long *)(puVar19 + 8) == 0x10) && (0xf < max_kk)) {
            auVar62 = vbroadcastss_avx512f(ZEXT416((uint)fVar98));
            iVar8 = 0xf;
            puVar14 = *(uint **)(puVar19 + 0x18);
            pauVar15 = (undefined1 (*) [64])(**(long **)(puVar19 + 0x50) + lVar23);
            do {
              pauVar17 = pauVar15;
              auVar63 = vmulps_avx512f(auVar62,*pauVar17);
              auVar64 = vmovdqa64_avx512f(auVar60);
              in_ZMM14 = vpternlogd_avx512f(auVar64,auVar63,auVar61,0xf8);
              auVar63 = vaddps_avx512f(auVar63,in_ZMM14);
              auVar63 = vcvttps2dq_avx512f(auVar63);
              auVar46 = vpmovsdb_avx512f(auVar63);
              auVar46 = vpmaxsb_avx(auVar46,auVar85);
              in_ZMM13 = ZEXT1664(auVar46);
              *(undefined1 (*) [16])*pauVar13 = auVar46;
              pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
              iVar8 = iVar8 + 0x10;
              pauVar15 = (undefined1 (*) [64])(*pauVar17 + (long)(iVar20 << 4) * 4);
            } while (iVar8 < max_kk);
            pfVar16 = (float *)(*pauVar17 + *(long *)(puVar19 + 0x30) * 4);
          }
          else {
            puVar14 = *(uint **)(puVar19 + 0x18);
          }
          if ((*(int *)(puVar19 + 8) == 8) && (7 < max_kk)) {
            fVar101 = *(float *)((long)scales->data + lVar25 * 4);
            iVar8 = 7;
            do {
              auVar68._0_4_ = fVar101 * *pfVar16;
              auVar68._4_4_ = fVar101 * pfVar16[1];
              auVar68._8_4_ = fVar101 * pfVar16[2];
              auVar68._12_4_ = fVar101 * pfVar16[3];
              auVar68._16_4_ = fVar101 * pfVar16[4];
              auVar68._20_4_ = fVar101 * pfVar16[5];
              auVar68._28_36_ = in_ZMM13._28_36_;
              auVar68._24_4_ = fVar101 * pfVar16[6];
              auVar47 = vpternlogd_avx512vl(auVar90,auVar68._0_32_,auVar93,0xf8);
              in_ZMM14 = ZEXT3264(auVar47);
              auVar132._0_4_ = (int)(auVar68._0_4_ + auVar47._0_4_);
              auVar132._4_4_ = (int)(auVar68._4_4_ + auVar47._4_4_);
              auVar132._8_4_ = (int)(auVar68._8_4_ + auVar47._8_4_);
              auVar132._12_4_ = (int)(auVar68._12_4_ + auVar47._12_4_);
              auVar132._16_4_ = (int)(auVar68._16_4_ + auVar47._16_4_);
              auVar132._20_4_ = (int)(auVar68._20_4_ + auVar47._20_4_);
              auVar132._24_4_ = (int)(auVar68._24_4_ + auVar47._24_4_);
              auVar132._28_4_ = (int)(in_ZMM13._28_4_ + auVar47._28_4_);
              auVar46 = vpmovsdb_avx512vl(auVar132);
              auVar124._8_8_ = 0;
              auVar124._0_8_ = auVar46._0_8_;
              auVar46 = vpmaxsb_avx(auVar124,auVar85);
              in_ZMM13 = ZEXT1664(auVar46);
              *(long *)*pauVar13 = auVar46._0_8_;
              pauVar13 = (undefined1 (*) [64])(*pauVar13 + 8);
              iVar8 = iVar8 + 8;
              pfVar16 = pfVar16 + iVar20 * 8;
            } while (iVar8 < max_kk);
          }
          if ((*(int *)(puVar19 + 8) == 4) && (3 < max_kk)) {
            fVar101 = *(float *)((long)scales->data + lVar25 * 4);
            iVar8 = 3;
            do {
              auVar125._0_4_ = fVar101 * *pfVar16;
              auVar125._4_4_ = fVar101 * pfVar16[1];
              auVar125._8_4_ = fVar101 * pfVar16[2];
              auVar125._12_4_ = fVar101 * pfVar16[3];
              auVar46 = vpternlogd_avx512vl(auVar94,auVar125,auVar97,0xf8);
              in_ZMM14 = ZEXT1664(auVar46);
              auVar126._0_4_ = (int)(auVar125._0_4_ + auVar46._0_4_);
              auVar126._4_4_ = (int)(auVar125._4_4_ + auVar46._4_4_);
              auVar126._8_4_ = (int)(auVar125._8_4_ + auVar46._8_4_);
              auVar126._12_4_ = (int)(auVar125._12_4_ + auVar46._12_4_);
              auVar46 = vpackssdw_avx(auVar126,auVar126);
              auVar46 = vpminsw_avx(auVar46,auVar100);
              auVar46 = vpmaxsw_avx(auVar46,auVar108);
              auVar46 = vpacksswb_avx(auVar46,auVar46);
              in_ZMM13 = ZEXT1664(auVar46);
              *(int *)*pauVar13 = auVar46._0_4_;
              pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
              iVar8 = iVar8 + 4;
              pfVar16 = pfVar16 + iVar20 * 4;
            } while (iVar8 < max_kk);
          }
          if (*(int *)(puVar19 + 8) == 1) {
            iVar8 = 0;
            if (3 < max_kk) {
              fVar101 = *(float *)((long)scales->data + lVar25 * 4);
              iVar8 = 3;
              do {
                auVar46 = vpcmpeqd_avx(in_ZMM14._0_16_,in_ZMM14._0_16_);
                auVar46 = vgatherdps((undefined1  [16])0x0,auVar46);
                auVar127._0_4_ = auVar46._0_4_ * fVar101;
                auVar127._4_4_ = auVar46._4_4_ * fVar101;
                auVar127._8_4_ = auVar46._8_4_ * fVar101;
                auVar127._12_4_ = auVar46._12_4_ * fVar101;
                auVar46 = vpternlogd_avx512vl(auVar94,auVar127,auVar97,0xf8);
                in_ZMM14 = ZEXT1664(auVar46);
                auVar128._0_4_ = (int)(auVar127._0_4_ + auVar46._0_4_);
                auVar128._4_4_ = (int)(auVar127._4_4_ + auVar46._4_4_);
                auVar128._8_4_ = (int)(auVar127._8_4_ + auVar46._8_4_);
                auVar128._12_4_ = (int)(auVar127._12_4_ + auVar46._12_4_);
                auVar46 = vpackssdw_avx(auVar128,auVar128);
                auVar46 = vpminsw_avx(auVar46,auVar100);
                auVar46 = vpmaxsw_avx(auVar46,auVar108);
                auVar46 = vpacksswb_avx(auVar46,auVar46);
                in_ZMM13 = ZEXT1664(auVar46);
                *(int *)*pauVar13 = auVar46._0_4_;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
                iVar8 = iVar8 + 4;
                pfVar16 = pfVar16 + iVar20 * 4;
              } while (iVar8 < max_kk);
              iVar8 = *(int *)(puVar19 + 0x14);
            }
            iVar10 = max_kk - iVar8;
            if (iVar10 != 0 && iVar8 <= max_kk) {
              do {
                fVar101 = fVar98 * *pfVar16;
                auVar46 = vpternlogd_avx512vl(auVar112,ZEXT416((uint)fVar101),auVar97,0xf8);
                in_ZMM13 = ZEXT1664(auVar46);
                auVar46 = ZEXT416((uint)(fVar101 + auVar46._0_4_));
                auVar46 = vroundss_avx(auVar46,auVar46,0xb);
                iVar8 = (int)auVar46._0_4_;
                if (iVar8 < -0x7e) {
                  iVar8 = -0x7f;
                }
                if (0x7e < iVar8) {
                  iVar8 = 0x7f;
                }
                (*pauVar13)[0] = (char)iVar8;
                pauVar13 = (undefined1 (*) [64])(*pauVar13 + 1);
                pfVar16 = pfVar16 + uVar24;
                iVar10 = iVar10 + -1;
              } while (iVar10 != 0);
            }
          }
          lVar22 = lVar22 + 1;
          lVar23 = lVar23 + *(long *)(puVar19 + 0x28);
        } while (lVar22 != *(long *)(puVar19 + 0x60));
      }
    }
    else {
      transpose_pack_A_tile_fp32_to_int8_avxvnni(A,AT,i,max_ii,k,max_kk,scales);
    }
  }
  else {
    transpose_pack_A_tile_fp32_to_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk,scales);
  }
  return;
}

Assistant:

static void transpose_pack_A_tile_quantize(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk, const Mat& scales)
{
    transpose_pack_A_tile_fp32_to_int8(A, AT, i, max_ii, k, max_kk, scales);
}